

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx::forward
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  float *pfVar24;
  undefined4 uVar25;
  undefined1 (*pauVar26) [32];
  bool bVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined4 *puVar31;
  float *pfVar32;
  long lVar33;
  undefined1 (*pauVar34) [32];
  Layer *pLVar35;
  uint uVar36;
  size_t sVar37;
  Option *opt_00;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  float *pfVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  float fVar48;
  float sum1 [4];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar72 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  float sum0 [4];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar73 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  ulong uVar181;
  ulong uVar182;
  ulong uVar183;
  ulong uVar184;
  undefined8 in_stack_fffffffffffffd98;
  Option *opt_01;
  int TILE_K;
  int TILE_N;
  Mat local_228;
  ulong local_1e0;
  long local_1d8;
  ulong local_1d0;
  uint local_1c4;
  float *local_1c0;
  Mat local_1b8;
  long local_168;
  int TILE_M;
  Mat local_158;
  uint local_10c;
  long local_108;
  long local_100;
  long local_f8;
  uint local_ec;
  int local_e8;
  int local_e4;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined1 (*local_a8) [32];
  size_t local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar25 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  auVar72 = in_ZMM2._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar14 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar14;
  }
  iVar14 = (this->super_Convolution).kernel_w;
  iVar29 = (this->super_Convolution).kernel_h;
  if (iVar29 == 1 && (iVar14 == 1 && bottom_blob->dims == 1)) {
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    if ((bottom_blob->elemsize & 0xf) == 0) {
      if (&local_158 != bottom_blob) {
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_158.data = bottom_blob->data;
        local_158.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
        local_158.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
        local_158.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
        local_158.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
        local_158.elempack = bottom_blob->elempack;
        local_158.allocator = bottom_blob->allocator;
        uVar10 = bottom_blob->d;
        local_158.d = uVar10;
      }
      local_158.dims = 3;
      local_158.w = 1;
      local_158.h = 1;
      local_158.c = bottom_blob->w;
      local_158.cstep = 1;
    }
    else {
      Mat::reshape(&local_1b8,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
      piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      local_158.data = local_1b8.data;
      local_158.refcount._0_4_ = local_1b8.refcount._0_4_;
      local_158.refcount._4_4_ = local_1b8.refcount._4_4_;
      local_158.elemsize._0_4_ = (uint)local_1b8.elemsize;
      local_158.elemsize._4_4_ = local_1b8.elemsize._4_4_;
      local_158.elempack = local_1b8.elempack;
      local_158.allocator = local_1b8.allocator;
      local_158.dims = local_1b8.dims;
      local_158.w = local_1b8.w;
      local_158.h = local_1b8.h;
      local_158.d = local_1b8.d;
      local_158.c = local_1b8.c;
      local_158.cstep = local_1b8.cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar14 = -100;
      if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
      goto LAB_0020c8be;
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    iVar14 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_158,&local_1b8,opt)
    ;
    if (iVar14 == 0) {
      if (((uint)local_1b8.elemsize & 0xf) == 0) {
        if (&local_1b8 != top_blob) {
          piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_1b8.data;
          top_blob->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(uint)local_1b8.elemsize);
          top_blob->elempack = local_1b8.elempack;
          top_blob->allocator = local_1b8.allocator;
          top_blob->dims = local_1b8.dims;
          top_blob->w = local_1b8.w;
          top_blob->h = local_1b8.h;
          top_blob->d = local_1b8.d;
          top_blob->c = local_1b8.c;
          top_blob->cstep = local_1b8.cstep;
        }
        top_blob->dims = 1;
        local_158.cstep = (size_t)local_1b8.c;
        top_blob->w = local_1b8.c;
        top_blob->h = 1;
        top_blob->c = 1;
      }
      else {
        Mat::reshape(&local_228,&local_1b8,local_1b8.c,opt->blob_allocator);
        if (&local_228 != top_blob) {
          piVar2 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_228.data;
          top_blob->refcount = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
          top_blob->elemsize = local_228.elemsize;
          top_blob->elempack = local_228.elempack;
          top_blob->allocator = local_228.allocator;
          top_blob->dims = local_228.dims;
          top_blob->w = local_228.w;
          top_blob->h = local_228.h;
          top_blob->d = local_228.d;
          top_blob->c = local_228.c;
          top_blob->cstep = local_228.cstep;
        }
        piVar2 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0020c849;
      }
      iVar14 = 0;
    }
LAB_0020c849:
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_0020c8be:
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.w = 0;
    local_1b8.dims = 0;
    local_1b8.elempack = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.cstep = 0;
    local_1b8.c = 0;
    piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return iVar14;
  }
  iVar28 = bottom_blob->c;
  iVar45 = (this->super_Convolution).dilation_w;
  uVar23 = bottom_blob->elemsize;
  iVar42 = (this->super_Convolution).dilation_h;
  iVar30 = bottom_blob->elempack;
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_228,opt);
  iVar15 = local_228.h;
  iVar16 = -100;
  if ((local_228.data == (void *)0x0) || ((long)local_228.c * local_228.cstep == 0))
  goto LAB_0020cc39;
  opt_01 = (Option *)CONCAT44(uVar25,local_228.w);
  iVar45 = (~((iVar14 + -1) * iVar45) + local_228.w) / (this->super_Convolution).stride_w + 1;
  iVar14 = (~((iVar29 + -1) * iVar42) + local_228.h) / (this->super_Convolution).stride_h + 1;
  lVar41 = 1;
  if (opt->use_packing_layout == true) {
    uVar21 = (this->super_Convolution).num_output;
    lVar41 = 8;
    if ((uVar21 & 7) != 0) {
      lVar41 = (ulong)((uVar21 & 3) == 0) * 3 + 1;
    }
  }
  iVar29 = (int)lVar41;
  sVar37 = lVar41 * (uVar23 / (ulong)(long)iVar30);
  Mat::create(top_blob,iVar45,iVar14,(this->super_Convolution).num_output / iVar29,sVar37,iVar29,
              opt->blob_allocator);
  uVar25 = (undefined4)(sVar37 >> 0x20);
  iVar16 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0020cc39;
  if (((opt->use_packing_layout == false) &&
      ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
          (iVar42 = (this->super_Convolution).dilation_w, iVar42 != 1)) &&
         (iVar16 = (this->super_Convolution).dilation_h, iVar16 == iVar42)) &&
        (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)))) &&
       (iVar42 <= iVar45)))) && (iVar16 <= iVar14)) {
    iVar16 = forwardDilation_x86(this,&local_228,top_blob,opt);
    goto LAB_0020cc39;
  }
  iVar28 = iVar28 * iVar30;
  bVar13 = opt->use_winograd23_convolution;
  if (((bVar13 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar27 = false;
  }
  else {
    bVar27 = true;
    if (iVar28 < 9) {
      bVar27 = 8 < (this->super_Convolution).num_output;
    }
  }
  auVar74._0_4_ = (this->super_Convolution).kernel_w;
  auVar74._4_4_ = (this->super_Convolution).kernel_h;
  auVar74._8_4_ = (this->super_Convolution).dilation_w;
  auVar74._12_4_ = (this->super_Convolution).dilation_h;
  if ((((auVar74 == _DAT_005f2240) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar27)))) {
    iVar14 = (this->super_Convolution).num_output;
    bVar11 = test_prefer_winograd63(iVar28,iVar14,(int)opt_01,iVar15);
    bVar12 = test_prefer_winograd23(iVar28,iVar14,(int)opt_01,iVar15);
    bVar27 = !bVar11 && !bVar12;
    if ((bVar12) &&
       (((bVar13 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
        (bVar12 = true,
        (long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)))) {
      bVar27 = true;
      bVar12 = false;
    }
    if ((bVar11) &&
       (((opt->use_winograd63_convolution != true ||
         ((this->weight_winograd63_data).data == (void *)0x0)) ||
        (bVar11 = true,
        (long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep == 0)))) {
      bVar27 = true;
      bVar11 = false;
    }
    if ((bVar27) &&
       (((opt->use_winograd43_convolution != true ||
         ((this->weight_winograd43_data).data == (void *)0x0)) ||
        ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep == 0)))) {
      if (((opt->use_winograd63_convolution == true) &&
          ((this->weight_winograd63_data).data != (void *)0x0)) &&
         ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep != 0)) {
        bVar11 = true;
      }
      else {
        bVar12 = true;
      }
      bVar27 = false;
    }
    iVar14 = this->nT;
    iVar29 = iVar14;
    if (iVar14 == 0) {
      iVar29 = opt->num_threads;
    }
    if (opt->num_threads != iVar14 && iVar14 != 0) {
      forward();
    }
    if (bVar12 == false) {
      if (bVar27) {
        iVar16 = conv3x3s1_winograd43
                           (&local_228,top_blob,&this->weight_winograd43_data,
                            &(this->super_Convolution).bias_data,iVar29,opt);
      }
      else {
        iVar16 = 0;
        if (bVar11 != false) {
          iVar16 = conv3x3s1_winograd63
                             (&local_228,top_blob,&this->weight_winograd63_data,
                              &(this->super_Convolution).bias_data,iVar29,opt);
        }
      }
    }
    else {
      iVar16 = conv3x3s1_winograd23
                         (&local_228,top_blob,&this->weight_winograd23_data,
                          &(this->super_Convolution).bias_data,iVar29,opt);
    }
    if (iVar16 == 0) {
      pLVar35 = this->activation;
      iVar16 = 0;
      if (pLVar35 != (Layer *)0x0) {
        (*pLVar35->_vptr_Layer[9])(pLVar35,top_blob,opt);
        iVar16 = 0;
      }
    }
    goto LAB_0020cc39;
  }
  iVar15 = get_cpu_level2_cache_size();
  iVar14 = (this->super_Convolution).num_output;
  auVar91._0_4_ = (this->super_Convolution).kernel_w;
  auVar91._4_4_ = (this->super_Convolution).kernel_h;
  auVar91._8_4_ = (this->super_Convolution).dilation_w;
  auVar91._12_4_ = (this->super_Convolution).dilation_h;
  iVar45 = (this->super_Convolution).stride_w;
  iVar42 = (this->super_Convolution).stride_h;
  opt_00 = (Option *)CONCAT44(uVar25,auVar91._0_4_);
  if ((opt->use_sgemm_convolution != true) ||
     (auVar91._0_4_ * auVar91._4_4_ * auVar91._12_4_ * iVar42 *
      iVar28 * iVar14 * auVar91._8_4_ * iVar45 * 8 <= iVar15 && (iVar28 < 0x11 && iVar14 < 0x11))) {
    auVar73._8_4_ = 1;
    auVar73._0_8_ = 0x100000001;
    auVar73._12_4_ = 1;
    auVar74 = vpcmpeqd_avx(auVar91,auVar73);
    auVar74 = vpmovsxdq_avx(auVar74);
    auVar72 = vpcmpeqd_avx(auVar72,auVar72);
    if (((auVar72 & ~auVar74) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
        SUB161(auVar72 & ~auVar74,0xf) < '\0') {
      if ((iVar30 == 8) && (iVar29 == 8)) {
        if ((iVar42 == 1 && iVar45 == 1) && auVar91 == _DAT_005f2240) {
          conv3x3s1_pack8_avx(&local_228,top_blob,&this->weight_data_tm,
                              &(this->super_Convolution).bias_data,opt_00);
        }
        else {
          auVar74 = vpcmpeqd_avx(auVar91,_DAT_005f2240);
          uVar25 = vmovmskps_avx(auVar74);
          auVar84._8_4_ = 2;
          auVar84._0_8_ = 0x200000002;
          auVar84._12_4_ = 2;
          auVar74 = vpcmpeqd_avx(auVar91,auVar84);
          auVar74 = vpmovsxdq_avx(auVar74);
          if (((((((auVar72 & ~auVar74) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 -1 < SUB161(auVar72 & ~auVar74,0xf)) && iVar45 == 1) && iVar42 == 1) &
              (byte)uVar25 >> 2 & (byte)uVar25 >> 3) != 1) goto LAB_0020c9a6;
          conv2x2s1_pack8_avx(&local_228,top_blob,&this->weight_data_tm,
                              &(this->super_Convolution).bias_data,opt_00);
        }
LAB_0020cb2c:
        pLVar35 = this->activation;
        if (pLVar35 != (Layer *)0x0) {
LAB_0020cb38:
          (*pLVar35->_vptr_Layer[9])(pLVar35,top_blob,opt);
        }
      }
      else {
LAB_0020c9a6:
        if ((iVar30 == 1) && (iVar29 == 8)) {
          auVar72 = vpcmpeqd_avx(auVar91,_DAT_005f2240);
          uVar21 = vmovmskps_avx(auVar72);
          if (iVar42 == 1 && (iVar45 == 1 && (uVar21 ^ 0xf) == 0)) {
            conv3x3s1_pack1to8_avx
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
          }
          else {
            if ((iVar42 != 2 || iVar45 != 2) || (char)(uVar21 ^ 0xf) != '\0') goto LAB_0020ca53;
            conv3x3s2_pack1to8_avx
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
          }
          goto LAB_0020cb2c;
        }
LAB_0020ca53:
        uVar21 = auVar91._0_4_ ^ 3;
        uVar36 = auVar91._4_4_ ^ 3;
        uVar22 = auVar91._8_4_ ^ 1;
        uVar46 = auVar91._12_4_ ^ 1;
        if (iVar42 == 1 &&
            (iVar45 == 1 &&
            ((uVar22 == 0 && uVar46 == 0) &&
            (((iVar29 == 1 && iVar30 == 8) && uVar21 == 0) && uVar36 == 0)))) {
          conv3x3s1_pack8to1_avx
                    (&local_228,top_blob,&this->weight_data_tm,&(this->super_Convolution).bias_data,
                     opt_00);
LAB_0020caba:
          pLVar35 = this->activation;
          if (pLVar35 == (Layer *)0x0) goto LAB_0020cb44;
          goto LAB_0020cb38;
        }
        if ((iVar30 == 1) && (iVar29 == 4)) {
          if ((iVar45 == 1 && iVar42 == 1) &&
              (((uVar21 == 0 && uVar36 == 0) && uVar22 == 0) && uVar46 == 0)) {
            conv3x3s1_pack1to4_sse
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
            goto LAB_0020cb2c;
          }
          if ((((uVar21 == 0 && uVar36 == 0) && uVar22 == 0) && uVar46 == 0) &&
              (iVar42 == 2 && iVar45 == 2)) {
            conv3x3s2_pack1to4_sse
                      (&local_228,top_blob,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,opt_00);
            goto LAB_0020caba;
          }
        }
        convolution_packed(&local_228,top_blob,&this->weight_data_tm,
                           &(this->super_Convolution).bias_data,auVar91._0_4_,auVar91._4_4_,
                           auVar91._8_4_,auVar91._12_4_,iVar45,iVar42,
                           (this->super_Convolution).activation_type,
                           &(this->super_Convolution).activation_params,opt_01);
      }
LAB_0020cb44:
      iVar16 = 0;
      goto LAB_0020cc39;
    }
  }
  uVar21 = this->nT;
  uVar36 = uVar21;
  if (uVar21 == 0) {
    uVar36 = opt->num_threads;
  }
  if (opt->num_threads != uVar21 && uVar21 != 0) {
    forward();
  }
  uVar21 = (this->super_Convolution).kernel_w;
  local_b0 = (ulong)uVar21;
  uVar22 = (this->super_Convolution).kernel_h;
  local_b8 = (ulong)uVar22;
  local_c0 = (ulong)(uint)(this->super_Convolution).dilation_w;
  local_c8 = (ulong)(uint)(this->super_Convolution).dilation_h;
  local_d0 = (ulong)(uint)(this->super_Convolution).stride_w;
  local_d8 = (ulong)(uint)(this->super_Convolution).stride_h;
  uVar46 = top_blob->elempack * top_blob->c;
  uVar47 = top_blob->h * top_blob->w;
  uVar23 = (ulong)uVar47;
  iVar29 = uVar22 * uVar21 * local_228.c * local_228.elempack;
  local_98 = (ulong)uVar36;
  convolution_im2col_gemm_get_optimal_tile_mnk(uVar46,uVar47,iVar29,&TILE_M,&TILE_N,&TILE_K,uVar36);
  local_ec = (int)(uVar46 + TILE_M + -1) / TILE_M;
  iVar28 = (int)(uVar47 + TILE_N + -1) / TILE_N;
  iVar14 = (iVar29 + TILE_K + -1) / TILE_K;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize._0_4_ = 0;
  local_158.elemsize._4_4_ = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  local_168 = CONCAT44(local_168._4_4_,iVar14);
  Mat::create(&local_158,TILE_K * TILE_N,iVar14,iVar28,4,opt->workspace_allocator);
  iVar16 = -100;
  if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
    iVar28 = iVar28 * (int)local_168;
    local_1c0 = (float *)CONCAT44(local_1c0._4_4_,iVar28);
    local_70 = uVar23;
    local_68 = (ulong)uVar46;
    if (0 < iVar28) {
      iVar14 = (int)local_b0;
      iVar28 = (int)local_b8;
      bVar11 = iVar28 == 1 && iVar14 == 1;
      bVar13 = (int)local_c8 == 1 && (int)local_c0 == 1;
      bVar12 = (int)local_d8 == 1 && (int)local_d0 == 1;
      local_f8 = CONCAT71(local_f8._1_7_,(bVar11 && bVar13) && bVar12);
      bVar27 = (int)local_d8 == 2 && (int)local_d0 == 2;
      local_80 = CONCAT71(local_80._1_7_,bVar11 && bVar27);
      bVar11 = (iVar28 == 3 && iVar14 == 3) && bVar13;
      local_90 = CONCAT71(local_90._1_7_,bVar11 && bVar12);
      local_10c = CONCAT31(local_10c._1_3_,bVar11 && bVar27);
      bVar11 = (iVar28 == 5 && iVar14 == 5) && bVar13;
      local_108 = CONCAT71(local_108._1_7_,bVar12 && bVar11);
      local_100 = CONCAT71(local_100._1_7_,bVar11 && bVar27);
      local_e0 = CONCAT71(local_e0._1_7_,((iVar28 == 7 && iVar14 == 7) && bVar13) && bVar27);
      iVar14 = 0;
      do {
        iVar28 = TILE_N * (iVar14 / (int)local_168);
        uVar36 = TILE_K * (int)((long)iVar14 % (long)(int)local_168);
        uVar21 = (int)uVar23 - iVar28;
        if (TILE_N < (int)uVar21) {
          uVar21 = TILE_N;
        }
        iVar45 = iVar29 - uVar36;
        if (TILE_K < (int)(iVar29 - uVar36)) {
          iVar45 = TILE_K;
        }
        local_1b8.cstep = (size_t)local_158.w;
        local_1b8.data =
             (void *)((long)local_158.data +
                     ((long)iVar14 % (long)(int)local_168 & 0xffffffffU) * local_1b8.cstep *
                     CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) +
                     (long)(iVar14 / (int)local_168) * local_158.cstep *
                     CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = (undefined4)local_158.elemsize;
        local_1b8.elemsize._4_4_ = local_158.elemsize._4_4_;
        local_1b8.elempack = local_158.elempack;
        local_1b8.allocator = local_158.allocator;
        local_1b8.dims = 2;
        local_1b8.w = local_158.w;
        local_1b8.h = 1;
        local_1b8.d = 1;
        local_1b8.c = 1;
        if ((char)local_f8 == '\0') {
          if ((char)local_80 == '\0') {
            if ((char)local_90 != '\0') {
              uVar184 = 1;
              uVar23 = 1;
LAB_00209ed3:
              uVar20 = 3;
              goto LAB_00209eda;
            }
            if ((char)local_10c != '\0') {
              uVar184 = 2;
              uVar23 = 2;
              goto LAB_00209ed3;
            }
            if ((char)local_108 != '\0') {
              uVar184 = 1;
              uVar23 = 1;
LAB_00209fd8:
              uVar20 = 5;
              goto LAB_00209eda;
            }
            if ((char)local_100 != '\0') {
              uVar184 = 2;
              uVar23 = 2;
              goto LAB_00209fd8;
            }
            uVar20 = local_b0;
            uVar181 = local_b8;
            uVar182 = local_c0;
            uVar183 = local_c8;
            uVar23 = local_d0;
            uVar184 = local_d8;
            if ((char)local_e0 != '\0') {
              uVar184 = 2;
              uVar23 = 2;
              uVar20 = 7;
              goto LAB_00209eda;
            }
          }
          else {
            uVar184 = 2;
            uVar23 = 2;
            uVar20 = 1;
LAB_00209eda:
            uVar181 = uVar20;
            uVar182 = 1;
            uVar183 = 1;
          }
          convolution_im2col_input_tile_impl
                    (&local_228,&local_1b8,iVar28,uVar21,uVar36,iVar45,(int)uVar20,(int)uVar181,
                     (int)uVar182,(int)uVar183,(int)uVar23,(int)uVar184);
        }
        else {
          lVar41 = 0;
          lVar17 = (long)(int)uVar36;
          lVar33 = (long)iVar28;
          local_1d8 = CONCAT44(local_1d8._4_4_,uVar21);
          local_1e0 = CONCAT44(local_1e0._4_4_,local_228.elempack);
          pauVar26 = (undefined1 (*) [32])local_1b8.data;
          if (0xb < (int)uVar21) {
            iVar28 = iVar45 + 3;
            if (-1 < iVar45) {
              iVar28 = iVar45;
            }
            iVar42 = iVar45 + 7;
            if (-1 < iVar45) {
              iVar42 = iVar45;
            }
            uVar46 = uVar36 + 3;
            uVar22 = uVar36 + 7;
            if (-1 < (int)uVar36) {
              uVar46 = uVar36;
              uVar22 = uVar36;
            }
            lVar38 = 0;
            do {
              if (7 < iVar45 && local_228.elempack == 8) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar38 + lVar33) * 0x20 +
                           local_228.cstep * (long)((int)uVar22 >> 3) * local_228.elemsize);
                iVar30 = iVar42 >> 3;
                do {
                  auVar66 = vunpcklps_avx(*pauVar18,pauVar18[1]);
                  auVar86 = vunpckhps_avx(*pauVar18,pauVar18[1]);
                  auVar151 = vunpcklps_avx(pauVar18[2],pauVar18[3]);
                  auVar100 = vunpckhps_avx(pauVar18[2],pauVar18[3]);
                  auVar171 = vunpcklps_avx(pauVar18[4],pauVar18[5]);
                  auVar85 = vunpckhps_avx(pauVar18[4],pauVar18[5]);
                  auVar135 = vunpcklps_avx(pauVar18[6],pauVar18[7]);
                  auVar101 = vunpckhps_avx(pauVar18[6],pauVar18[7]);
                  auVar152 = vunpcklps_avx(pauVar18[8],pauVar18[9]);
                  auVar127 = vunpckhps_avx(pauVar18[8],pauVar18[9]);
                  auVar158 = vunpcklps_avx(pauVar18[10],pauVar18[0xb]);
                  auVar113 = vunpckhps_avx(pauVar18[10],pauVar18[0xb]);
                  auVar134 = vunpcklpd_avx(auVar66,auVar151);
                  auVar66 = vunpckhpd_avx(auVar66,auVar151);
                  auVar151 = vunpcklpd_avx(auVar86,auVar100);
                  auVar86 = vunpckhpd_avx(auVar86,auVar100);
                  auVar142 = vunpcklpd_avx(auVar171,auVar135);
                  auVar100 = vunpckhpd_avx(auVar171,auVar135);
                  auVar171 = vunpcklpd_avx(auVar85,auVar101);
                  auVar85 = vunpckhpd_avx(auVar85,auVar101);
                  auVar135 = vunpcklpd_avx(auVar152,auVar158);
                  auVar101 = vunpckhpd_avx(auVar152,auVar158);
                  auVar152 = vunpcklpd_avx(auVar127,auVar113);
                  auVar127 = vunpckhpd_avx(auVar127,auVar113);
                  auVar158._16_16_ = auVar142._0_16_;
                  auVar158._0_16_ = auVar134._0_16_;
                  auVar113 = vperm2f128_avx(auVar134,auVar142,0x31);
                  auVar165._16_16_ = auVar66._0_16_;
                  auVar165._0_16_ = auVar135._0_16_;
                  auVar66 = vperm2f128_avx(auVar135,auVar66,0x31);
                  auVar134._16_16_ = auVar101._0_16_;
                  auVar134._0_16_ = auVar100._0_16_;
                  auVar100 = vperm2f128_avx(auVar100,auVar101,0x31);
                  auVar142._16_16_ = auVar171._0_16_;
                  auVar142._0_16_ = auVar151._0_16_;
                  auVar101 = vperm2f128_avx(auVar151,auVar171,0x31);
                  auVar171._16_16_ = auVar86._0_16_;
                  auVar171._0_16_ = auVar152._0_16_;
                  auVar86 = vperm2f128_avx(auVar152,auVar86,0x31);
                  auVar151._16_16_ = auVar127._0_16_;
                  auVar151._0_16_ = auVar85._0_16_;
                  auVar85 = vperm2f128_avx(auVar85,auVar127,0x31);
                  *pauVar26 = auVar158;
                  pauVar26[1] = auVar165;
                  pauVar26[2] = auVar134;
                  pauVar26[3] = auVar142;
                  pauVar26[4] = auVar171;
                  pauVar26[5] = auVar151;
                  pauVar26[6] = auVar113;
                  pauVar26[7] = auVar66;
                  pauVar26[8] = auVar100;
                  pauVar26[9] = auVar101;
                  pauVar26[10] = auVar86;
                  pauVar26[0xb] = auVar85;
                  pauVar26 = pauVar26 + 0xc;
                  pauVar18 = pauVar18 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (3 < iVar45 && local_228.elempack == 4) {
                pauVar19 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar38 + lVar33) * 0x10 +
                           local_228.cstep * (long)((int)uVar46 >> 2) * local_228.elemsize);
                iVar30 = iVar28 >> 2;
                do {
                  auVar91 = vpunpckldq_avx(*pauVar19,pauVar19[1]);
                  auVar73 = vpunpckldq_avx(pauVar19[2],pauVar19[3]);
                  auVar72 = vpunpckhdq_avx(*pauVar19,pauVar19[1]);
                  auVar74 = vpunpckhdq_avx(pauVar19[2],pauVar19[3]);
                  auVar84 = vpunpcklqdq_avx(auVar91,auVar73);
                  auVar91 = vpunpckhqdq_avx(auVar91,auVar73);
                  auVar73 = vpunpcklqdq_avx(auVar72,auVar74);
                  auVar72 = vpunpckhqdq_avx(auVar72,auVar74);
                  auVar74 = vunpcklps_avx(pauVar19[4],pauVar19[5]);
                  auVar107 = vunpcklps_avx(pauVar19[6],pauVar19[7]);
                  auVar75 = vunpckhps_avx(pauVar19[4],pauVar19[5]);
                  auVar92 = vunpckhps_avx(pauVar19[6],pauVar19[7]);
                  auVar124 = vunpcklpd_avx(auVar74,auVar107);
                  auVar74 = vunpckhpd_avx(auVar74,auVar107);
                  auVar132 = vunpcklpd_avx(auVar75,auVar92);
                  auVar75 = vunpckhpd_avx(auVar75,auVar92);
                  auVar92 = vunpcklps_avx(pauVar19[8],pauVar19[9]);
                  auVar146 = vunpcklps_avx(pauVar19[10],pauVar19[0xb]);
                  auVar107 = vunpckhps_avx(pauVar19[8],pauVar19[9]);
                  auVar117 = vunpckhps_avx(pauVar19[10],pauVar19[0xb]);
                  auVar140 = vunpcklpd_avx(auVar92,auVar146);
                  auVar92 = vunpckhpd_avx(auVar92,auVar146);
                  auVar146 = vunpcklpd_avx(auVar107,auVar117);
                  auVar107 = vunpckhpd_avx(auVar107,auVar117);
                  *(undefined1 (*) [16])*pauVar26 = auVar84;
                  *(undefined1 (*) [16])(*pauVar26 + 0x10) = auVar124;
                  *(undefined1 (*) [16])pauVar26[1] = auVar140;
                  *(undefined1 (*) [16])(pauVar26[1] + 0x10) = auVar91;
                  *(undefined1 (*) [16])pauVar26[2] = auVar74;
                  *(undefined1 (*) [16])(pauVar26[2] + 0x10) = auVar92;
                  *(undefined1 (*) [16])pauVar26[3] = auVar73;
                  *(undefined1 (*) [16])(pauVar26[3] + 0x10) = auVar132;
                  *(undefined1 (*) [16])pauVar26[4] = auVar146;
                  *(undefined1 (*) [16])(pauVar26[4] + 0x10) = auVar72;
                  *(undefined1 (*) [16])pauVar26[5] = auVar75;
                  *(undefined1 (*) [16])(pauVar26[5] + 0x10) = auVar107;
                  pauVar26 = pauVar26 + 6;
                  pauVar19 = pauVar19 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar45) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           lVar33 * 4 + lVar38 * 4 + local_228.cstep * lVar17 * local_228.elemsize);
                iVar30 = iVar45;
                do {
                  auVar72 = *(undefined1 (*) [16])pauVar18[1];
                  *pauVar26 = *pauVar18;
                  *(undefined1 (*) [16])pauVar26[1] = auVar72;
                  pauVar26 = (undefined1 (*) [32])(pauVar26[1] + 0x10);
                  pauVar18 = (undefined1 (*) [32])(*pauVar18 + local_228.cstep * 4);
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              lVar41 = lVar38 + 0xc;
              uVar23 = lVar38 + 0x17;
              lVar38 = lVar41;
            } while (uVar23 < uVar21);
          }
          lVar38 = (long)(int)uVar21;
          if ((int)lVar41 + 7 < (int)uVar21) {
            local_88 = CONCAT71(local_88._1_7_,iVar45 < 1);
            iVar28 = iVar45 + 3;
            if (-1 < iVar45) {
              iVar28 = iVar45;
            }
            iVar42 = iVar45 + 7;
            if (-1 < iVar45) {
              iVar42 = iVar45;
            }
            uVar46 = uVar36 + 3;
            uVar22 = uVar36 + 7;
            if (-1 < (int)uVar36) {
              uVar46 = uVar36;
              uVar22 = uVar36;
            }
            lVar43 = (long)(int)lVar41;
            do {
              if (7 < iVar45 && local_228.elempack == 8) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar33 + lVar43) * 0x20 +
                           local_228.cstep * (long)((int)uVar22 >> 3) * local_228.elemsize);
                iVar30 = iVar42 >> 3;
                do {
                  auVar66 = vunpcklps_avx(*pauVar18,pauVar18[1]);
                  auVar86 = vunpckhps_avx(*pauVar18,pauVar18[1]);
                  auVar113 = vunpcklps_avx(pauVar18[2],pauVar18[3]);
                  auVar100 = vunpckhps_avx(pauVar18[2],pauVar18[3]);
                  auVar151 = vunpcklps_avx(pauVar18[4],pauVar18[5]);
                  auVar85 = vunpckhps_avx(pauVar18[4],pauVar18[5]);
                  auVar142 = vunpcklps_avx(pauVar18[6],pauVar18[7]);
                  auVar101 = vunpckhps_avx(pauVar18[6],pauVar18[7]);
                  auVar127 = vunpcklpd_avx(auVar66,auVar113);
                  auVar66 = vunpckhpd_avx(auVar66,auVar113);
                  auVar113 = vunpcklpd_avx(auVar86,auVar100);
                  auVar86 = vunpckhpd_avx(auVar86,auVar100);
                  auVar134 = vunpcklpd_avx(auVar151,auVar142);
                  auVar100 = vunpckhpd_avx(auVar151,auVar142);
                  auVar151 = vunpcklpd_avx(auVar85,auVar101);
                  auVar85 = vunpckhpd_avx(auVar85,auVar101);
                  auVar135._16_16_ = auVar134._0_16_;
                  auVar135._0_16_ = auVar127._0_16_;
                  auVar152._16_16_ = auVar100._0_16_;
                  auVar152._0_16_ = auVar66._0_16_;
                  auVar159._16_16_ = auVar151._0_16_;
                  auVar159._0_16_ = auVar113._0_16_;
                  auVar166._16_16_ = auVar85._0_16_;
                  auVar166._0_16_ = auVar86._0_16_;
                  auVar101 = vperm2f128_avx(auVar127,auVar134,0x31);
                  auVar66 = vperm2f128_avx(auVar66,auVar100,0x31);
                  auVar100 = vperm2f128_avx(auVar113,auVar151,0x31);
                  auVar86 = vperm2f128_avx(auVar86,auVar85,0x31);
                  *pauVar26 = auVar135;
                  pauVar26[1] = auVar152;
                  pauVar26[2] = auVar159;
                  pauVar26[3] = auVar166;
                  pauVar26[4] = auVar101;
                  pauVar26[5] = auVar66;
                  pauVar26[6] = auVar100;
                  pauVar26[7] = auVar86;
                  pauVar26 = pauVar26 + 8;
                  pauVar18 = pauVar18 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (3 < iVar45 && local_228.elempack == 4) {
                pauVar19 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar33 + lVar43) * 0x10 +
                           local_228.cstep * (long)((int)uVar46 >> 2) * local_228.elemsize);
                iVar30 = iVar28 >> 2;
                do {
                  auVar91 = vpunpckldq_avx(*pauVar19,pauVar19[1]);
                  auVar73 = vpunpckldq_avx(pauVar19[2],pauVar19[3]);
                  auVar72 = vpunpckhdq_avx(*pauVar19,pauVar19[1]);
                  auVar74 = vpunpckhdq_avx(pauVar19[2],pauVar19[3]);
                  auVar84 = vpunpcklqdq_avx(auVar91,auVar73);
                  auVar91 = vpunpckhqdq_avx(auVar91,auVar73);
                  auVar73 = vpunpcklqdq_avx(auVar72,auVar74);
                  auVar72 = vpunpckhqdq_avx(auVar72,auVar74);
                  auVar74 = vunpcklps_avx(pauVar19[4],pauVar19[5]);
                  auVar117 = vunpcklps_avx(pauVar19[6],pauVar19[7]);
                  auVar75 = vunpckhps_avx(pauVar19[4],pauVar19[5]);
                  auVar92 = vunpckhps_avx(pauVar19[6],pauVar19[7]);
                  auVar107 = vunpcklpd_avx(auVar74,auVar117);
                  auVar74 = vunpckhpd_avx(auVar74,auVar117);
                  auVar117 = vunpcklpd_avx(auVar75,auVar92);
                  auVar75 = vunpckhpd_avx(auVar75,auVar92);
                  *(undefined1 (*) [16])*pauVar26 = auVar84;
                  *(undefined1 (*) [16])(*pauVar26 + 0x10) = auVar107;
                  *(undefined1 (*) [16])pauVar26[1] = auVar91;
                  *(undefined1 (*) [16])(pauVar26[1] + 0x10) = auVar74;
                  *(undefined1 (*) [16])pauVar26[2] = auVar73;
                  *(undefined1 (*) [16])(pauVar26[2] + 0x10) = auVar117;
                  *(undefined1 (*) [16])pauVar26[3] = auVar72;
                  *(undefined1 (*) [16])(pauVar26[3] + 0x10) = auVar75;
                  pauVar26 = pauVar26 + 4;
                  pauVar19 = pauVar19 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (local_228.elempack == 1 && iVar45 >= 1) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           lVar33 * 4 + lVar43 * 4 + local_228.cstep * lVar17 * local_228.elemsize);
                iVar30 = iVar45;
                do {
                  *pauVar26 = *pauVar18;
                  pauVar26 = pauVar26 + 1;
                  pauVar18 = (undefined1 (*) [32])(*pauVar18 + local_228.cstep * 4);
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              lVar41 = lVar43 + 8;
              bVar13 = lVar43 < lVar38 + -0xf;
              lVar43 = lVar41;
            } while (bVar13);
          }
          if ((int)((uint)lVar41 | 3) < (int)uVar21) {
            iVar28 = iVar45 + 3;
            if (-1 < iVar45) {
              iVar28 = iVar45;
            }
            iVar42 = iVar45 + 7;
            if (-1 < iVar45) {
              iVar42 = iVar45;
            }
            uVar46 = uVar36 + 3;
            uVar22 = uVar36 + 7;
            if (-1 < (int)uVar36) {
              uVar46 = uVar36;
              uVar22 = uVar36;
            }
            lVar43 = (long)(int)(uint)lVar41;
            do {
              if (7 < iVar45 && local_228.elempack == 8) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar43 + lVar33) * 0x20 +
                           local_228.cstep * (long)((int)uVar22 >> 3) * local_228.elemsize);
                iVar30 = iVar42 >> 3;
                do {
                  auVar66 = vunpcklps_avx(*pauVar18,pauVar18[1]);
                  auVar86 = vunpckhps_avx(*pauVar18,pauVar18[1]);
                  auVar101 = vunpcklps_avx(pauVar18[2],pauVar18[3]);
                  auVar100 = vunpckhps_avx(pauVar18[2],pauVar18[3]);
                  auVar85 = vunpcklpd_avx(auVar66,auVar101);
                  auVar66 = vunpckhpd_avx(auVar66,auVar101);
                  auVar101 = vunpcklpd_avx(auVar86,auVar100);
                  auVar86 = vunpckhpd_avx(auVar86,auVar100);
                  auVar100._16_16_ = auVar66._0_16_;
                  auVar100._0_16_ = auVar85._0_16_;
                  auVar127._16_16_ = auVar86._0_16_;
                  auVar127._0_16_ = auVar101._0_16_;
                  auVar66 = vperm2f128_avx(auVar85,auVar66,0x31);
                  auVar86 = vperm2f128_avx(auVar101,auVar86,0x31);
                  *pauVar26 = auVar100;
                  pauVar26[1] = auVar127;
                  pauVar26[2] = auVar66;
                  pauVar26[3] = auVar86;
                  pauVar26 = pauVar26 + 4;
                  pauVar18 = pauVar18 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (3 < iVar45 && local_228.elempack == 4) {
                pauVar19 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar43 + lVar33) * 0x10 +
                           local_228.cstep * (long)((int)uVar46 >> 2) * local_228.elemsize);
                iVar30 = iVar28 >> 2;
                do {
                  auVar91 = vpunpckldq_avx(*pauVar19,pauVar19[1]);
                  auVar73 = vpunpckldq_avx(pauVar19[2],pauVar19[3]);
                  auVar72 = vpunpckhdq_avx(*pauVar19,pauVar19[1]);
                  auVar74 = vpunpckhdq_avx(pauVar19[2],pauVar19[3]);
                  auVar84 = vpunpcklqdq_avx(auVar91,auVar73);
                  auVar91 = vpunpckhqdq_avx(auVar91,auVar73);
                  auVar73 = vpunpcklqdq_avx(auVar72,auVar74);
                  auVar72 = vpunpckhqdq_avx(auVar72,auVar74);
                  *(undefined1 (*) [16])*pauVar26 = auVar84;
                  *(undefined1 (*) [16])(*pauVar26 + 0x10) = auVar91;
                  *(undefined1 (*) [16])pauVar26[1] = auVar73;
                  *(undefined1 (*) [16])(pauVar26[1] + 0x10) = auVar72;
                  pauVar26 = pauVar26 + 2;
                  pauVar19 = pauVar19 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar45) {
                pauVar19 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           lVar33 * 4 + lVar43 * 4 + local_228.cstep * lVar17 * local_228.elemsize);
                iVar30 = iVar45;
                do {
                  *(undefined1 (*) [16])*pauVar26 = *pauVar19;
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
                  pauVar19 = (undefined1 (*) [16])(*pauVar19 + local_228.cstep * 4);
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              lVar41 = lVar43 + 4;
              lVar39 = lVar43 + 7;
              lVar43 = lVar41;
            } while (lVar39 < lVar38);
          }
          uVar22 = (uint)lVar41;
          if ((int)(uVar22 | 1) < (int)uVar21) {
            iVar28 = iVar45 + 3;
            if (-1 < iVar45) {
              iVar28 = iVar45;
            }
            iVar42 = iVar45 + 7;
            if (-1 < iVar45) {
              iVar42 = iVar45;
            }
            uVar47 = uVar36 + 3;
            uVar46 = uVar36 + 7;
            if (-1 < (int)uVar36) {
              uVar47 = uVar36;
              uVar46 = uVar36;
            }
            lVar43 = lVar33 * 4 + (long)(int)uVar22 * 4;
            lVar39 = (long)(int)uVar22;
            do {
              if (7 < iVar45 && local_228.elempack == 8) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar39 + lVar33) * 0x20 +
                           local_228.cstep * (long)((int)uVar46 >> 3) * local_228.elemsize);
                iVar30 = iVar42 >> 3;
                do {
                  auVar86 = vunpcklps_avx(*pauVar18,pauVar18[1]);
                  auVar66 = vunpckhps_avx(*pauVar18,pauVar18[1]);
                  auVar85._16_16_ = auVar66._0_16_;
                  auVar85._0_16_ = auVar86._0_16_;
                  auVar66 = vperm2f128_avx(auVar86,auVar66,0x31);
                  *pauVar26 = auVar85;
                  pauVar26[1] = auVar66;
                  pauVar26 = pauVar26 + 2;
                  pauVar18 = pauVar18 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (3 < iVar45 && local_228.elempack == 4) {
                pauVar19 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar39 + lVar33) * 0x10 +
                           local_228.cstep * (long)((int)uVar47 >> 2) * local_228.elemsize);
                iVar30 = iVar28 >> 2;
                do {
                  auVar74 = vpunpckldq_avx(*pauVar19,pauVar19[1]);
                  auVar72 = vpunpckhdq_avx(*pauVar19,pauVar19[1]);
                  *(undefined1 (*) [16])*pauVar26 = auVar74;
                  *(undefined1 (*) [16])(*pauVar26 + 0x10) = auVar72;
                  pauVar26 = pauVar26 + 1;
                  pauVar19 = pauVar19 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar45) {
                puVar31 = (undefined4 *)
                          (local_228.cstep * lVar17 * local_228.elemsize + lVar43 +
                          (long)local_228.data);
                iVar30 = iVar45;
                do {
                  *(undefined4 *)*pauVar26 = *puVar31;
                  *(undefined4 *)(*pauVar26 + 4) = puVar31[1];
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + 8);
                  puVar31 = puVar31 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              lVar41 = lVar39 + 2;
              lVar40 = lVar39 + 3;
              lVar43 = lVar43 + 8;
              lVar39 = lVar41;
            } while (lVar40 < lVar38);
          }
          local_1d0 = (ulong)uVar36;
          if ((int)lVar41 < (int)uVar21) {
            iVar28 = iVar45 + 3;
            if (-1 < iVar45) {
              iVar28 = iVar45;
            }
            iVar42 = iVar45 + 7;
            if (-1 < iVar45) {
              iVar42 = iVar45;
            }
            uVar21 = uVar36 + 3;
            uVar22 = uVar36 + 7;
            if (-1 < (int)uVar36) {
              uVar21 = uVar36;
              uVar22 = uVar36;
            }
            lVar43 = (long)(int)lVar41;
            lVar41 = lVar33 * 4 + lVar43 * 4;
            do {
              if (7 < iVar45 && local_228.elempack == 8) {
                pauVar18 = (undefined1 (*) [32])
                           ((long)local_228.data +
                           (lVar43 + lVar33) * 0x20 +
                           local_228.cstep * (long)((int)uVar22 >> 3) * local_228.elemsize);
                iVar30 = iVar42 >> 3;
                do {
                  *pauVar26 = *pauVar18;
                  pauVar26 = pauVar26 + 1;
                  pauVar18 = pauVar18 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (3 < iVar45 && local_228.elempack == 4) {
                pauVar19 = (undefined1 (*) [16])
                           ((long)local_228.data +
                           (lVar43 + lVar33) * 0x10 +
                           local_228.cstep * (long)((int)uVar21 >> 2) * local_228.elemsize);
                iVar30 = iVar28 >> 2;
                do {
                  *(undefined1 (*) [16])*pauVar26 = *pauVar19;
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + 0x10);
                  pauVar19 = pauVar19 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              if (local_228.elempack == 1 && 0 < iVar45) {
                puVar31 = (undefined4 *)
                          (local_228.cstep * lVar17 * local_228.elemsize + lVar41 +
                          (long)local_228.data);
                iVar30 = iVar45;
                do {
                  *(undefined4 *)*pauVar26 = *puVar31;
                  pauVar26 = (undefined1 (*) [32])(*pauVar26 + 4);
                  puVar31 = puVar31 + local_228.cstep;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
              }
              lVar43 = lVar43 + 1;
              lVar41 = lVar41 + 4;
            } while (lVar43 != lVar38);
          }
        }
        uVar23 = local_70;
        piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_1b8.allocator == (Allocator *)0x0) {
              if ((undefined1 (*) [32])local_1b8.data != (undefined1 (*) [32])0x0) {
                free(local_1b8.data);
              }
            }
            else {
              (*(local_1b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 != (int)local_1c0);
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    if (TILE_K < iVar29) {
      Mat::create(&local_1b8,TILE_M * TILE_N,1,(int)local_98,4,opt->workspace_allocator);
      iVar16 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0))
      goto LAB_0020a19f;
    }
    else {
LAB_0020a19f:
      if (0 < (int)local_ec) {
        uVar184 = 0;
        do {
          uVar20 = uVar184;
          iVar14 = TILE_M;
          if (TILE_K < iVar29) {
            iVar28 = get_omp_thread_num();
            local_a8 = (undefined1 (*) [32])
                       ((long)iVar28 * local_1b8.cstep *
                        CONCAT44(local_1b8.elemsize._4_4_,(uint)local_1b8.elemsize) +
                       (long)local_1b8.data);
          }
          else {
            local_a8 = (undefined1 (*) [32])0x0;
          }
          local_e8 = iVar14 * (int)uVar20;
          local_1c4 = (int)local_68 - local_e8;
          if (iVar14 < (int)local_1c4) {
            local_1c4 = iVar14;
          }
          if (0 < (int)uVar23) {
            local_108 = (long)local_e8;
            local_50 = (ulong)local_1c4;
            local_100 = (long)(int)local_1c4;
            iVar14 = 0;
            do {
              uVar21 = (int)uVar23 - iVar14;
              if (TILE_N < (int)uVar21) {
                uVar21 = TILE_N;
              }
              if (0 < iVar29) {
                local_e0 = (long)iVar14;
                iVar28 = 0;
                do {
                  local_74 = iVar29 - iVar28;
                  local_58 = (long)TILE_K;
                  iVar45 = local_74;
                  if (TILE_K < local_74) {
                    iVar45 = TILE_K;
                  }
                  pauVar26 = (undefined1 (*) [32])(this->super_Convolution).bias_data.data;
                  sVar37 = (this->weight_sgemm_data).elemsize;
                  pfVar32 = (float *)((long)(this->weight_sgemm_data).data +
                                     (long)(this->weight_sgemm_data).w * sVar37 *
                                     (long)(iVar28 / TILE_K) +
                                     (long)(local_e8 / TILE_M) * (this->weight_sgemm_data).cstep *
                                     sVar37);
                  local_1c0 = (float *)((long)local_158.data +
                                       (long)local_158.w *
                                       CONCAT44(local_158.elemsize._4_4_,
                                                (undefined4)local_158.elemsize) *
                                       (long)(iVar28 / TILE_K) +
                                       (long)(iVar14 / TILE_N) * local_158.cstep *
                                       CONCAT44(local_158.elemsize._4_4_,
                                                (undefined4)local_158.elemsize));
                  iVar15 = TILE_K + iVar28;
                  iVar42 = top_blob->elempack;
                  local_a0 = top_blob->cstep;
                  iVar30 = (int)local_a0;
                  pauVar18 = local_a8;
                  if ((int)local_1c4 < 8) {
                    uVar23 = 0;
                  }
                  else {
                    local_40 = (long)(iVar42 * iVar14);
                    lVar41 = (long)(iVar30 * 4);
                    lVar33 = (long)(iVar30 * 2);
                    local_1d0 = (long)(local_a0 * 0x300000000) >> 0x20;
                    local_1d8 = (long)((local_a0 << 0x20) * 5) >> 0x20;
                    local_1e0 = (long)((local_a0 << 0x21) * 3) >> 0x20;
                    local_168 = (long)(local_a0 * 0x700000000) >> 0x20;
                    local_80 = (long)(iVar30 * 3);
                    local_88 = (long)(iVar30 * 5);
                    local_90 = (long)(iVar30 * 6);
                    local_98 = (ulong)(iVar30 * 7);
                    local_f8 = (long)((local_a0 << 0x20) + 0x100000000) >> 0x20;
                    local_b0 = (ulong)(iVar30 * 2 + 1);
                    local_b8 = (ulong)(iVar30 * 3 + 1);
                    local_c0 = (ulong)(iVar30 * 4 + 1);
                    local_c8 = (ulong)(iVar30 * 5 + 1);
                    local_d0 = (ulong)(iVar30 * 6 + 1);
                    local_d8 = (ulong)(iVar30 * 7 + 1);
                    local_48 = (long)(iVar45 * 8) * 4;
                    lVar17 = (long)iVar30;
                    uVar23 = 0;
                    do {
                      local_38 = uVar23;
                      pauVar34 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 local_38 * 4 + local_108 * 4);
                      if (pauVar26 == (undefined1 (*) [32])0x0) {
                        pauVar34 = pauVar26;
                      }
                      pauVar26 = pauVar34;
                      uVar36 = 0;
                      pauVar34 = (undefined1 (*) [32])
                                 ((long)top_blob->data +
                                 local_40 * 4 + (local_38 + local_108) * lVar17 * 4);
                      pfVar44 = local_1c0;
                      if (0xb < (int)uVar21) {
                        uVar22 = 0;
                        do {
                          if (iVar28 == 0) {
                            if (pauVar26 == (undefined1 (*) [32])0x0) {
                              auVar71 = ZEXT1664((undefined1  [16])0x0);
                              auVar90 = ZEXT1664((undefined1  [16])0x0);
                              auVar106 = ZEXT1664((undefined1  [16])0x0);
                              auVar116 = ZEXT864(0) << 0x40;
                              auVar123 = ZEXT864(0) << 0x40;
                              auVar131 = ZEXT864(0) << 0x40;
                              auVar139 = ZEXT864(0) << 0x40;
                              auVar145 = ZEXT864(0) << 0x40;
                              auVar149 = ZEXT864(0) << 0x40;
                              auVar156 = ZEXT864(0) << 0x40;
                              auVar163 = ZEXT864(0) << 0x40;
                              auVar170 = ZEXT864(0) << 0x40;
                            }
                            else {
                              auVar66 = *pauVar26;
                              auVar71 = ZEXT3264(auVar66);
                              auVar90 = ZEXT3264(auVar66);
                              auVar106 = ZEXT3264(auVar66);
                              auVar116 = ZEXT3264(auVar66);
                              auVar123 = ZEXT3264(auVar66);
                              auVar131 = ZEXT3264(auVar66);
                              auVar139 = ZEXT3264(auVar66);
                              auVar145 = ZEXT3264(auVar66);
                              auVar149 = ZEXT3264(auVar66);
                              auVar156 = ZEXT3264(auVar66);
                              auVar163 = ZEXT3264(auVar66);
                              auVar170 = ZEXT3264(auVar66);
                            }
                          }
                          else {
                            auVar170 = ZEXT3264(*pauVar18);
                            auVar163 = ZEXT3264(pauVar18[1]);
                            auVar156 = ZEXT3264(pauVar18[2]);
                            auVar149 = ZEXT3264(pauVar18[3]);
                            auVar145 = ZEXT3264(pauVar18[4]);
                            auVar139 = ZEXT3264(pauVar18[5]);
                            auVar131 = ZEXT3264(pauVar18[6]);
                            auVar123 = ZEXT3264(pauVar18[7]);
                            auVar116 = ZEXT3264(pauVar18[8]);
                            auVar106 = ZEXT3264(pauVar18[9]);
                            auVar90 = ZEXT3264(pauVar18[10]);
                            auVar71 = ZEXT3264(pauVar18[0xb]);
                          }
                          auVar66 = auVar71._0_32_;
                          auVar86 = auVar90._0_32_;
                          auVar101 = auVar106._0_32_;
                          auVar113 = auVar116._0_32_;
                          auVar120 = auVar123._0_32_;
                          auVar128 = auVar131._0_32_;
                          auVar136 = auVar139._0_32_;
                          auVar143 = auVar145._0_32_;
                          auVar147 = auVar149._0_32_;
                          auVar153 = auVar156._0_32_;
                          auVar160 = auVar163._0_32_;
                          auVar167 = auVar170._0_32_;
                          pfVar24 = pfVar32;
                          iVar16 = iVar45;
                          if (0 < iVar45) {
                            do {
                              fVar3 = *pfVar24;
                              fVar4 = pfVar24[1];
                              fVar5 = pfVar24[2];
                              fVar6 = pfVar24[3];
                              fVar7 = pfVar24[4];
                              fVar8 = pfVar24[5];
                              fVar9 = pfVar24[6];
                              fVar48 = *pfVar44;
                              auVar167._0_4_ = fVar48 * fVar3 + auVar170._0_4_;
                              auVar167._4_4_ = fVar48 * fVar4 + auVar170._4_4_;
                              auVar167._8_4_ = fVar48 * fVar5 + auVar170._8_4_;
                              auVar167._12_4_ = fVar48 * fVar6 + auVar170._12_4_;
                              auVar167._16_4_ = fVar48 * fVar7 + auVar170._16_4_;
                              auVar167._20_4_ = fVar48 * fVar8 + auVar170._20_4_;
                              auVar167._24_4_ = fVar48 * fVar9 + auVar170._24_4_;
                              auVar167._28_4_ = fVar48 + auVar170._28_4_;
                              auVar170 = ZEXT3264(auVar167);
                              fVar48 = pfVar44[1];
                              auVar160._0_4_ = fVar48 * fVar3 + auVar163._0_4_;
                              auVar160._4_4_ = fVar48 * fVar4 + auVar163._4_4_;
                              auVar160._8_4_ = fVar48 * fVar5 + auVar163._8_4_;
                              auVar160._12_4_ = fVar48 * fVar6 + auVar163._12_4_;
                              auVar160._16_4_ = fVar48 * fVar7 + auVar163._16_4_;
                              auVar160._20_4_ = fVar48 * fVar8 + auVar163._20_4_;
                              auVar160._24_4_ = fVar48 * fVar9 + auVar163._24_4_;
                              auVar160._28_4_ = fVar48 + auVar163._28_4_;
                              auVar163 = ZEXT3264(auVar160);
                              fVar48 = pfVar44[2];
                              auVar153._0_4_ = fVar48 * fVar3 + auVar156._0_4_;
                              auVar153._4_4_ = fVar48 * fVar4 + auVar156._4_4_;
                              auVar153._8_4_ = fVar48 * fVar5 + auVar156._8_4_;
                              auVar153._12_4_ = fVar48 * fVar6 + auVar156._12_4_;
                              auVar153._16_4_ = fVar48 * fVar7 + auVar156._16_4_;
                              auVar153._20_4_ = fVar48 * fVar8 + auVar156._20_4_;
                              auVar153._24_4_ = fVar48 * fVar9 + auVar156._24_4_;
                              auVar153._28_4_ = fVar48 + auVar156._28_4_;
                              auVar156 = ZEXT3264(auVar153);
                              fVar48 = pfVar44[3];
                              auVar147._0_4_ = fVar48 * fVar3 + auVar149._0_4_;
                              auVar147._4_4_ = fVar48 * fVar4 + auVar149._4_4_;
                              auVar147._8_4_ = fVar48 * fVar5 + auVar149._8_4_;
                              auVar147._12_4_ = fVar48 * fVar6 + auVar149._12_4_;
                              auVar147._16_4_ = fVar48 * fVar7 + auVar149._16_4_;
                              auVar147._20_4_ = fVar48 * fVar8 + auVar149._20_4_;
                              auVar147._24_4_ = fVar48 * fVar9 + auVar149._24_4_;
                              auVar147._28_4_ = fVar48 + auVar149._28_4_;
                              auVar149 = ZEXT3264(auVar147);
                              fVar48 = pfVar44[4];
                              auVar143._0_4_ = fVar48 * fVar3 + auVar145._0_4_;
                              auVar143._4_4_ = fVar48 * fVar4 + auVar145._4_4_;
                              auVar143._8_4_ = fVar48 * fVar5 + auVar145._8_4_;
                              auVar143._12_4_ = fVar48 * fVar6 + auVar145._12_4_;
                              auVar143._16_4_ = fVar48 * fVar7 + auVar145._16_4_;
                              auVar143._20_4_ = fVar48 * fVar8 + auVar145._20_4_;
                              auVar143._24_4_ = fVar48 * fVar9 + auVar145._24_4_;
                              auVar143._28_4_ = fVar48 + auVar145._28_4_;
                              auVar145 = ZEXT3264(auVar143);
                              fVar48 = pfVar44[5];
                              auVar136._0_4_ = fVar48 * fVar3 + auVar139._0_4_;
                              auVar136._4_4_ = fVar48 * fVar4 + auVar139._4_4_;
                              auVar136._8_4_ = fVar48 * fVar5 + auVar139._8_4_;
                              auVar136._12_4_ = fVar48 * fVar6 + auVar139._12_4_;
                              auVar136._16_4_ = fVar48 * fVar7 + auVar139._16_4_;
                              auVar136._20_4_ = fVar48 * fVar8 + auVar139._20_4_;
                              auVar136._24_4_ = fVar48 * fVar9 + auVar139._24_4_;
                              auVar136._28_4_ = fVar48 + auVar139._28_4_;
                              auVar139 = ZEXT3264(auVar136);
                              fVar48 = pfVar44[6];
                              auVar128._0_4_ = fVar48 * fVar3 + auVar131._0_4_;
                              auVar128._4_4_ = fVar48 * fVar4 + auVar131._4_4_;
                              auVar128._8_4_ = fVar48 * fVar5 + auVar131._8_4_;
                              auVar128._12_4_ = fVar48 * fVar6 + auVar131._12_4_;
                              auVar128._16_4_ = fVar48 * fVar7 + auVar131._16_4_;
                              auVar128._20_4_ = fVar48 * fVar8 + auVar131._20_4_;
                              auVar128._24_4_ = fVar48 * fVar9 + auVar131._24_4_;
                              auVar128._28_4_ = fVar48 + auVar131._28_4_;
                              auVar131 = ZEXT3264(auVar128);
                              fVar48 = pfVar44[7];
                              auVar120._0_4_ = fVar48 * fVar3 + auVar123._0_4_;
                              auVar120._4_4_ = fVar48 * fVar4 + auVar123._4_4_;
                              auVar120._8_4_ = fVar48 * fVar5 + auVar123._8_4_;
                              auVar120._12_4_ = fVar48 * fVar6 + auVar123._12_4_;
                              auVar120._16_4_ = fVar48 * fVar7 + auVar123._16_4_;
                              auVar120._20_4_ = fVar48 * fVar8 + auVar123._20_4_;
                              auVar120._24_4_ = fVar48 * fVar9 + auVar123._24_4_;
                              auVar120._28_4_ = fVar48 + auVar123._28_4_;
                              auVar123 = ZEXT3264(auVar120);
                              fVar48 = pfVar44[8];
                              auVar113._0_4_ = fVar48 * fVar3 + auVar116._0_4_;
                              auVar113._4_4_ = fVar48 * fVar4 + auVar116._4_4_;
                              auVar113._8_4_ = fVar48 * fVar5 + auVar116._8_4_;
                              auVar113._12_4_ = fVar48 * fVar6 + auVar116._12_4_;
                              auVar113._16_4_ = fVar48 * fVar7 + auVar116._16_4_;
                              auVar113._20_4_ = fVar48 * fVar8 + auVar116._20_4_;
                              auVar113._24_4_ = fVar48 * fVar9 + auVar116._24_4_;
                              auVar113._28_4_ = fVar48 + auVar116._28_4_;
                              auVar116 = ZEXT3264(auVar113);
                              fVar48 = pfVar44[9];
                              auVar101._0_4_ = fVar48 * fVar3 + auVar106._0_4_;
                              auVar101._4_4_ = fVar48 * fVar4 + auVar106._4_4_;
                              auVar101._8_4_ = fVar48 * fVar5 + auVar106._8_4_;
                              auVar101._12_4_ = fVar48 * fVar6 + auVar106._12_4_;
                              auVar101._16_4_ = fVar48 * fVar7 + auVar106._16_4_;
                              auVar101._20_4_ = fVar48 * fVar8 + auVar106._20_4_;
                              auVar101._24_4_ = fVar48 * fVar9 + auVar106._24_4_;
                              auVar101._28_4_ = fVar48 + auVar106._28_4_;
                              auVar106 = ZEXT3264(auVar101);
                              fVar48 = pfVar44[10];
                              auVar86._0_4_ = fVar48 * fVar3 + auVar90._0_4_;
                              auVar86._4_4_ = fVar48 * fVar4 + auVar90._4_4_;
                              auVar86._8_4_ = fVar48 * fVar5 + auVar90._8_4_;
                              auVar86._12_4_ = fVar48 * fVar6 + auVar90._12_4_;
                              auVar86._16_4_ = fVar48 * fVar7 + auVar90._16_4_;
                              auVar86._20_4_ = fVar48 * fVar8 + auVar90._20_4_;
                              auVar86._24_4_ = fVar48 * fVar9 + auVar90._24_4_;
                              auVar86._28_4_ = fVar48 + auVar90._28_4_;
                              auVar90 = ZEXT3264(auVar86);
                              fVar48 = pfVar44[0xb];
                              auVar66._0_4_ = fVar48 * fVar3 + auVar71._0_4_;
                              auVar66._4_4_ = fVar48 * fVar4 + auVar71._4_4_;
                              auVar66._8_4_ = fVar48 * fVar5 + auVar71._8_4_;
                              auVar66._12_4_ = fVar48 * fVar6 + auVar71._12_4_;
                              auVar66._16_4_ = fVar48 * fVar7 + auVar71._16_4_;
                              auVar66._20_4_ = fVar48 * fVar8 + auVar71._20_4_;
                              auVar66._24_4_ = fVar48 * fVar9 + auVar71._24_4_;
                              auVar66._28_4_ = pfVar24[7] + auVar71._28_4_;
                              auVar71 = ZEXT3264(auVar66);
                              pfVar44 = pfVar44 + 0xc;
                              iVar16 = iVar16 + -1;
                              pfVar24 = pfVar24 + 8;
                            } while (iVar16 != 0);
                          }
                          if (iVar15 < iVar29) {
                            *pauVar18 = auVar167;
                            pauVar18[1] = auVar160;
                            pauVar18[2] = auVar153;
                            pauVar18[3] = auVar147;
                            pauVar18[4] = auVar143;
                            pauVar18[5] = auVar136;
                            pauVar18[6] = auVar128;
                            pauVar18[7] = auVar120;
                            pauVar18[8] = auVar113;
                            pauVar18[9] = auVar101;
                            pauVar18[10] = auVar86;
                            pauVar18[0xb] = auVar66;
                          }
                          else {
                            if (iVar42 == 8) {
                              *pauVar34 = auVar167;
                              pauVar34[1] = auVar160;
                              pauVar34[2] = auVar153;
                              pauVar34[3] = auVar147;
                              pauVar34[4] = auVar143;
                              pauVar34[5] = auVar136;
                              pauVar34[6] = auVar128;
                              pauVar34[7] = auVar120;
                              pauVar34[8] = auVar113;
                              pauVar34[9] = auVar101;
                              pauVar34[10] = auVar86;
                              pauVar34[0xb] = auVar66;
                              pauVar34 = pauVar34 + 0xc;
                            }
                            auVar73 = auVar113._0_16_;
                            auVar91 = auVar101._0_16_;
                            auVar74 = auVar86._0_16_;
                            auVar72 = auVar66._0_16_;
                            if (iVar42 == 4) {
                              auVar172._16_16_ = auVar160._0_16_;
                              auVar172._0_16_ = auVar167._0_16_;
                              *pauVar34 = auVar172;
                              auVar173._16_16_ = auVar147._0_16_;
                              auVar173._0_16_ = auVar153._0_16_;
                              pauVar34[1] = auVar173;
                              auVar174._16_16_ = auVar136._0_16_;
                              auVar174._0_16_ = auVar143._0_16_;
                              pauVar34[2] = auVar174;
                              auVar175._16_16_ = auVar120._0_16_;
                              auVar175._0_16_ = auVar128._0_16_;
                              pauVar34[3] = auVar175;
                              auVar176._16_16_ = auVar91;
                              auVar176._0_16_ = auVar73;
                              pauVar34[4] = auVar176;
                              auVar177._16_16_ = auVar72;
                              auVar177._0_16_ = auVar74;
                              pauVar34[5] = auVar177;
                              auVar100 = vperm2f128_avx(auVar167,auVar160,0x31);
                              *(undefined1 (*) [32])(*pauVar34 + lVar41 * 4) = auVar100;
                              auVar100 = vperm2f128_avx(auVar153,auVar147,0x31);
                              *(undefined1 (*) [32])(pauVar34[1] + lVar41 * 4) = auVar100;
                              auVar100 = vperm2f128_avx(auVar143,auVar136,0x31);
                              *(undefined1 (*) [32])(pauVar34[2] + lVar41 * 4) = auVar100;
                              auVar100 = vperm2f128_avx(auVar128,auVar120,0x31);
                              *(undefined1 (*) [32])(pauVar34[3] + lVar41 * 4) = auVar100;
                              auVar100 = vperm2f128_avx(auVar113,auVar101,0x31);
                              *(undefined1 (*) [32])(pauVar34[4] + lVar41 * 4) = auVar100;
                              auVar100 = vperm2f128_avx(auVar86,auVar66,0x31);
                              *(undefined1 (*) [32])(pauVar34[5] + lVar41 * 4) = auVar100;
                              pauVar34 = pauVar34 + 6;
                            }
                            if (iVar42 == 1) {
                              auVar100 = vunpcklps_avx(auVar167,auVar160);
                              auVar85 = vunpckhps_avx(auVar167,auVar160);
                              auVar171 = vunpcklps_avx(auVar153,auVar147);
                              auVar127 = vunpckhps_avx(auVar153,auVar147);
                              auVar152 = vunpcklps_avx(auVar143,auVar136);
                              auVar134 = vunpckhps_avx(auVar143,auVar136);
                              auVar158 = vunpcklps_avx(auVar128,auVar120);
                              auVar151 = vunpckhps_avx(auVar128,auVar120);
                              auVar142 = vunpcklpd_avx(auVar100,auVar171);
                              auVar100 = vunpckhpd_avx(auVar100,auVar171);
                              auVar171 = vunpcklpd_avx(auVar85,auVar127);
                              auVar85 = vunpckhpd_avx(auVar85,auVar127);
                              auVar135 = vunpcklpd_avx(auVar152,auVar158);
                              auVar127 = vunpckhpd_avx(auVar152,auVar158);
                              auVar152 = vunpcklpd_avx(auVar134,auVar151);
                              auVar134 = vunpckhpd_avx(auVar134,auVar151);
                              auVar137._16_16_ = auVar135._0_16_;
                              auVar137._0_16_ = auVar142._0_16_;
                              auVar178._16_16_ = auVar127._0_16_;
                              auVar178._0_16_ = auVar100._0_16_;
                              auVar179._16_16_ = auVar152._0_16_;
                              auVar179._0_16_ = auVar171._0_16_;
                              auVar180._16_16_ = auVar134._0_16_;
                              auVar180._0_16_ = auVar85._0_16_;
                              auVar151 = vperm2f128_avx(auVar142,auVar135,0x31);
                              auVar100 = vperm2f128_avx(auVar100,auVar127,0x31);
                              auVar127 = vperm2f128_avx(auVar171,auVar152,0x31);
                              auVar85 = vperm2f128_avx(auVar85,auVar134,0x31);
                              *pauVar34 = auVar137;
                              *(undefined1 (*) [32])(*pauVar34 + lVar17 * 4) = auVar178;
                              *(undefined1 (*) [32])(*pauVar34 + lVar33 * 4) = auVar179;
                              *(undefined1 (*) [32])(*pauVar34 + local_1d0 * 4) = auVar180;
                              *(undefined1 (*) [32])(*pauVar34 + lVar41 * 4) = auVar151;
                              *(undefined1 (*) [32])(*pauVar34 + local_1d8 * 4) = auVar100;
                              *(undefined1 (*) [32])(*pauVar34 + local_1e0 * 4) = auVar127;
                              *(undefined1 (*) [32])(*pauVar34 + local_168 * 4) = auVar85;
                              auVar84 = vunpcklps_avx(auVar73,auVar91);
                              auVar75 = vunpcklps_avx(auVar74,auVar72);
                              auVar91 = vunpckhps_avx(auVar73,auVar91);
                              auVar73 = vunpckhps_avx(auVar74,auVar72);
                              auVar72 = vmovlhps_avx(auVar84,auVar75);
                              auVar84 = vunpckhpd_avx(auVar84,auVar75);
                              auVar74 = vmovlhps_avx(auVar91,auVar73);
                              auVar75 = vunpckhpd_avx(auVar91,auVar73);
                              auVar73 = vunpcklps_avx(auVar113._16_16_,auVar101._16_16_);
                              auVar92 = vunpcklps_avx(auVar86._16_16_,auVar66._16_16_);
                              auVar107 = vunpckhps_avx(auVar113._16_16_,auVar101._16_16_);
                              auVar117 = vunpckhps_avx(auVar86._16_16_,auVar66._16_16_);
                              auVar91 = vmovlhps_avx(auVar73,auVar92);
                              auVar92 = vunpckhpd_avx(auVar73,auVar92);
                              auVar73 = vmovlhps_avx(auVar107,auVar117);
                              auVar107 = vunpckhpd_avx(auVar107,auVar117);
                              *(undefined1 (*) [16])pauVar34[1] = auVar72;
                              *(undefined1 (*) [16])(pauVar34[1] + lVar17 * 4) = auVar84;
                              *(undefined1 (*) [16])(pauVar34[1] + lVar33 * 4) = auVar74;
                              *(undefined1 (*) [16])(pauVar34[1] + local_1d0 * 4) = auVar75;
                              *(undefined1 (*) [16])(pauVar34[1] + lVar41 * 4) = auVar91;
                              *(undefined1 (*) [16])(pauVar34[1] + local_1d8 * 4) = auVar92;
                              *(undefined1 (*) [16])(pauVar34[1] + local_1e0 * 4) = auVar73;
                              *(undefined1 (*) [16])(pauVar34[1] + local_168 * 4) = auVar107;
                              pauVar34 = (undefined1 (*) [32])(pauVar34[1] + 0x10);
                            }
                          }
                          pauVar18 = pauVar18 + 0xc;
                          uVar36 = uVar22 + 0xc;
                          iVar16 = uVar22 + 0x17;
                          uVar22 = uVar36;
                        } while (iVar16 < (int)uVar21);
                      }
                      iVar16 = uVar36 + 7;
                      while (iVar16 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar139 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar66 = *pauVar26;
                            auVar71 = ZEXT3264(auVar66);
                            auVar90 = ZEXT3264(auVar66);
                            auVar106 = ZEXT3264(auVar66);
                            auVar116 = ZEXT3264(auVar66);
                            auVar123 = ZEXT3264(auVar66);
                            auVar131 = ZEXT3264(auVar66);
                            auVar139 = ZEXT3264(auVar66);
                            auVar145 = ZEXT3264(auVar66);
                          }
                        }
                        else {
                          auVar145 = ZEXT3264(*pauVar18);
                          auVar139 = ZEXT3264(pauVar18[1]);
                          auVar131 = ZEXT3264(pauVar18[2]);
                          auVar123 = ZEXT3264(pauVar18[3]);
                          auVar116 = ZEXT3264(pauVar18[4]);
                          auVar106 = ZEXT3264(pauVar18[5]);
                          auVar90 = ZEXT3264(pauVar18[6]);
                          auVar71 = ZEXT3264(pauVar18[7]);
                        }
                        auVar67 = auVar71._0_32_;
                        auVar87 = auVar90._0_32_;
                        auVar102 = auVar106._0_32_;
                        auVar114 = auVar116._0_32_;
                        auVar121 = auVar123._0_32_;
                        auVar129 = auVar131._0_32_;
                        auVar138 = auVar139._0_32_;
                        auVar144 = auVar145._0_32_;
                        if (0 < iVar45) {
                          lVar38 = 0;
                          iVar16 = iVar45;
                          do {
                            pfVar24 = (float *)((long)pfVar32 + lVar38);
                            fVar3 = *pfVar24;
                            fVar4 = pfVar24[1];
                            fVar5 = pfVar24[2];
                            fVar6 = pfVar24[3];
                            fVar7 = pfVar24[4];
                            fVar8 = pfVar24[5];
                            fVar9 = pfVar24[6];
                            fVar48 = *(float *)((long)pfVar44 + lVar38);
                            auVar144._0_4_ = fVar48 * fVar3 + auVar145._0_4_;
                            auVar144._4_4_ = fVar48 * fVar4 + auVar145._4_4_;
                            auVar144._8_4_ = fVar48 * fVar5 + auVar145._8_4_;
                            auVar144._12_4_ = fVar48 * fVar6 + auVar145._12_4_;
                            auVar144._16_4_ = fVar48 * fVar7 + auVar145._16_4_;
                            auVar144._20_4_ = fVar48 * fVar8 + auVar145._20_4_;
                            auVar144._24_4_ = fVar48 * fVar9 + auVar145._24_4_;
                            auVar144._28_4_ = fVar48 + auVar145._28_4_;
                            auVar145 = ZEXT3264(auVar144);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 4);
                            auVar138._0_4_ = fVar48 * fVar3 + auVar139._0_4_;
                            auVar138._4_4_ = fVar48 * fVar4 + auVar139._4_4_;
                            auVar138._8_4_ = fVar48 * fVar5 + auVar139._8_4_;
                            auVar138._12_4_ = fVar48 * fVar6 + auVar139._12_4_;
                            auVar138._16_4_ = fVar48 * fVar7 + auVar139._16_4_;
                            auVar138._20_4_ = fVar48 * fVar8 + auVar139._20_4_;
                            auVar138._24_4_ = fVar48 * fVar9 + auVar139._24_4_;
                            auVar138._28_4_ = fVar48 + auVar139._28_4_;
                            auVar139 = ZEXT3264(auVar138);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 8);
                            auVar129._0_4_ = fVar48 * fVar3 + auVar131._0_4_;
                            auVar129._4_4_ = fVar48 * fVar4 + auVar131._4_4_;
                            auVar129._8_4_ = fVar48 * fVar5 + auVar131._8_4_;
                            auVar129._12_4_ = fVar48 * fVar6 + auVar131._12_4_;
                            auVar129._16_4_ = fVar48 * fVar7 + auVar131._16_4_;
                            auVar129._20_4_ = fVar48 * fVar8 + auVar131._20_4_;
                            auVar129._24_4_ = fVar48 * fVar9 + auVar131._24_4_;
                            auVar129._28_4_ = fVar48 + auVar131._28_4_;
                            auVar131 = ZEXT3264(auVar129);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0xc);
                            auVar121._0_4_ = fVar48 * fVar3 + auVar123._0_4_;
                            auVar121._4_4_ = fVar48 * fVar4 + auVar123._4_4_;
                            auVar121._8_4_ = fVar48 * fVar5 + auVar123._8_4_;
                            auVar121._12_4_ = fVar48 * fVar6 + auVar123._12_4_;
                            auVar121._16_4_ = fVar48 * fVar7 + auVar123._16_4_;
                            auVar121._20_4_ = fVar48 * fVar8 + auVar123._20_4_;
                            auVar121._24_4_ = fVar48 * fVar9 + auVar123._24_4_;
                            auVar121._28_4_ = fVar48 + auVar123._28_4_;
                            auVar123 = ZEXT3264(auVar121);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0x10);
                            auVar114._0_4_ = fVar48 * fVar3 + auVar116._0_4_;
                            auVar114._4_4_ = fVar48 * fVar4 + auVar116._4_4_;
                            auVar114._8_4_ = fVar48 * fVar5 + auVar116._8_4_;
                            auVar114._12_4_ = fVar48 * fVar6 + auVar116._12_4_;
                            auVar114._16_4_ = fVar48 * fVar7 + auVar116._16_4_;
                            auVar114._20_4_ = fVar48 * fVar8 + auVar116._20_4_;
                            auVar114._24_4_ = fVar48 * fVar9 + auVar116._24_4_;
                            auVar114._28_4_ = fVar48 + auVar116._28_4_;
                            auVar116 = ZEXT3264(auVar114);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0x14);
                            auVar102._0_4_ = fVar48 * fVar3 + auVar106._0_4_;
                            auVar102._4_4_ = fVar48 * fVar4 + auVar106._4_4_;
                            auVar102._8_4_ = fVar48 * fVar5 + auVar106._8_4_;
                            auVar102._12_4_ = fVar48 * fVar6 + auVar106._12_4_;
                            auVar102._16_4_ = fVar48 * fVar7 + auVar106._16_4_;
                            auVar102._20_4_ = fVar48 * fVar8 + auVar106._20_4_;
                            auVar102._24_4_ = fVar48 * fVar9 + auVar106._24_4_;
                            auVar102._28_4_ = fVar48 + auVar106._28_4_;
                            auVar106 = ZEXT3264(auVar102);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0x18);
                            auVar87._0_4_ = fVar48 * fVar3 + auVar90._0_4_;
                            auVar87._4_4_ = fVar48 * fVar4 + auVar90._4_4_;
                            auVar87._8_4_ = fVar48 * fVar5 + auVar90._8_4_;
                            auVar87._12_4_ = fVar48 * fVar6 + auVar90._12_4_;
                            auVar87._16_4_ = fVar48 * fVar7 + auVar90._16_4_;
                            auVar87._20_4_ = fVar48 * fVar8 + auVar90._20_4_;
                            auVar87._24_4_ = fVar48 * fVar9 + auVar90._24_4_;
                            auVar87._28_4_ = fVar48 + auVar90._28_4_;
                            auVar90 = ZEXT3264(auVar87);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0x1c);
                            auVar67._0_4_ = fVar48 * fVar3 + auVar71._0_4_;
                            auVar67._4_4_ = fVar48 * fVar4 + auVar71._4_4_;
                            auVar67._8_4_ = fVar48 * fVar5 + auVar71._8_4_;
                            auVar67._12_4_ = fVar48 * fVar6 + auVar71._12_4_;
                            auVar67._16_4_ = fVar48 * fVar7 + auVar71._16_4_;
                            auVar67._20_4_ = fVar48 * fVar8 + auVar71._20_4_;
                            auVar67._24_4_ = fVar48 * fVar9 + auVar71._24_4_;
                            auVar67._28_4_ = pfVar24[7] + auVar71._28_4_;
                            auVar71 = ZEXT3264(auVar67);
                            lVar38 = lVar38 + 0x20;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                          pfVar44 = (float *)((long)pfVar44 + lVar38);
                        }
                        if (iVar15 < iVar29) {
                          *pauVar18 = auVar144;
                          pauVar18[1] = auVar138;
                          pauVar18[2] = auVar129;
                          pauVar18[3] = auVar121;
                          pauVar18[4] = auVar114;
                          pauVar18[5] = auVar102;
                          pauVar18[6] = auVar87;
                          pauVar18[7] = auVar67;
                        }
                        else {
                          if (iVar42 == 8) {
                            *pauVar34 = auVar144;
                            pauVar34[1] = auVar138;
                            pauVar34[2] = auVar129;
                            pauVar34[3] = auVar121;
                            pauVar34[4] = auVar114;
                            pauVar34[5] = auVar102;
                            pauVar34[6] = auVar87;
                            pauVar34[7] = auVar67;
                            pauVar34 = pauVar34 + 8;
                          }
                          if (iVar42 == 4) {
                            auVar148._16_16_ = auVar138._0_16_;
                            auVar148._0_16_ = auVar144._0_16_;
                            auVar154._16_16_ = auVar121._0_16_;
                            auVar154._0_16_ = auVar129._0_16_;
                            auVar161._16_16_ = auVar102._0_16_;
                            auVar161._0_16_ = auVar114._0_16_;
                            auVar168._16_16_ = auVar67._0_16_;
                            auVar168._0_16_ = auVar87._0_16_;
                            auVar66 = vperm2f128_avx(auVar144,auVar138,0x31);
                            auVar86 = vperm2f128_avx(auVar129,auVar121,0x31);
                            auVar100 = vperm2f128_avx(auVar114,auVar102,0x31);
                            auVar85 = vperm2f128_avx(auVar87,auVar67,0x31);
                            *pauVar34 = auVar148;
                            pauVar34[1] = auVar154;
                            pauVar34[2] = auVar161;
                            pauVar34[3] = auVar168;
                            *(undefined1 (*) [32])(*pauVar34 + lVar41 * 4) = auVar66;
                            *(undefined1 (*) [32])(pauVar34[1] + lVar41 * 4) = auVar86;
                            *(undefined1 (*) [32])(pauVar34[2] + lVar41 * 4) = auVar100;
                            *(undefined1 (*) [32])(pauVar34[3] + lVar41 * 4) = auVar85;
                            pauVar34 = pauVar34 + 4;
                          }
                          if (iVar42 == 1) {
                            auVar66 = vunpcklps_avx(auVar144,auVar138);
                            auVar86 = vunpckhps_avx(auVar144,auVar138);
                            auVar113 = vunpcklps_avx(auVar129,auVar121);
                            auVar100 = vunpckhps_avx(auVar129,auVar121);
                            auVar151 = vunpcklps_avx(auVar114,auVar102);
                            auVar85 = vunpckhps_avx(auVar114,auVar102);
                            auVar142 = vunpcklps_avx(auVar87,auVar67);
                            auVar101 = vunpckhps_avx(auVar87,auVar67);
                            auVar127 = vunpcklpd_avx(auVar66,auVar113);
                            auVar66 = vunpckhpd_avx(auVar66,auVar113);
                            auVar113 = vunpcklpd_avx(auVar86,auVar100);
                            auVar86 = vunpckhpd_avx(auVar86,auVar100);
                            auVar134 = vunpcklpd_avx(auVar151,auVar142);
                            auVar100 = vunpckhpd_avx(auVar151,auVar142);
                            auVar151 = vunpcklpd_avx(auVar85,auVar101);
                            auVar85 = vunpckhpd_avx(auVar85,auVar101);
                            auVar103._16_16_ = auVar134._0_16_;
                            auVar103._0_16_ = auVar127._0_16_;
                            auVar155._16_16_ = auVar100._0_16_;
                            auVar155._0_16_ = auVar66._0_16_;
                            auVar162._16_16_ = auVar151._0_16_;
                            auVar162._0_16_ = auVar113._0_16_;
                            auVar169._16_16_ = auVar85._0_16_;
                            auVar169._0_16_ = auVar86._0_16_;
                            auVar101 = vperm2f128_avx(auVar127,auVar134,0x31);
                            auVar66 = vperm2f128_avx(auVar66,auVar100,0x31);
                            auVar100 = vperm2f128_avx(auVar113,auVar151,0x31);
                            auVar86 = vperm2f128_avx(auVar86,auVar85,0x31);
                            *pauVar34 = auVar103;
                            *(undefined1 (*) [32])(*pauVar34 + lVar17 * 4) = auVar155;
                            *(undefined1 (*) [32])(*pauVar34 + lVar33 * 4) = auVar162;
                            *(undefined1 (*) [32])(*pauVar34 + local_1d0 * 4) = auVar169;
                            *(undefined1 (*) [32])(*pauVar34 + lVar41 * 4) = auVar101;
                            *(undefined1 (*) [32])(*pauVar34 + local_1d8 * 4) = auVar66;
                            *(undefined1 (*) [32])(*pauVar34 + local_1e0 * 4) = auVar100;
                            *(undefined1 (*) [32])(*pauVar34 + local_168 * 4) = auVar86;
                            pauVar34 = pauVar34 + 1;
                          }
                        }
                        pauVar18 = pauVar18 + 8;
                        iVar16 = uVar36 + 0xf;
                        uVar36 = uVar36 + 8;
                      }
                      uVar22 = uVar36 | 3;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar66 = *pauVar26;
                            auVar71 = ZEXT3264(auVar66);
                            auVar90 = ZEXT3264(auVar66);
                            auVar106 = ZEXT3264(auVar66);
                            auVar116 = ZEXT3264(auVar66);
                          }
                        }
                        else {
                          auVar116 = ZEXT3264(*pauVar18);
                          auVar106 = ZEXT3264(pauVar18[1]);
                          auVar90 = ZEXT3264(pauVar18[2]);
                          auVar71 = ZEXT3264(pauVar18[3]);
                        }
                        auVar68 = auVar71._0_32_;
                        auVar88 = auVar90._0_32_;
                        auVar104 = auVar106._0_32_;
                        auVar115 = auVar116._0_32_;
                        if (0 < iVar45) {
                          lVar38 = 0;
                          iVar16 = iVar45;
                          do {
                            pfVar24 = (float *)((long)pfVar32 + lVar38 * 2);
                            fVar3 = *pfVar24;
                            fVar4 = pfVar24[1];
                            fVar5 = pfVar24[2];
                            fVar6 = pfVar24[3];
                            fVar7 = pfVar24[4];
                            fVar8 = pfVar24[5];
                            fVar9 = pfVar24[6];
                            fVar48 = *(float *)((long)pfVar44 + lVar38);
                            auVar115._0_4_ = fVar48 * fVar3 + auVar116._0_4_;
                            auVar115._4_4_ = fVar48 * fVar4 + auVar116._4_4_;
                            auVar115._8_4_ = fVar48 * fVar5 + auVar116._8_4_;
                            auVar115._12_4_ = fVar48 * fVar6 + auVar116._12_4_;
                            auVar115._16_4_ = fVar48 * fVar7 + auVar116._16_4_;
                            auVar115._20_4_ = fVar48 * fVar8 + auVar116._20_4_;
                            auVar115._24_4_ = fVar48 * fVar9 + auVar116._24_4_;
                            auVar115._28_4_ = fVar48 + auVar116._28_4_;
                            auVar116 = ZEXT3264(auVar115);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 4);
                            auVar104._0_4_ = fVar48 * fVar3 + auVar106._0_4_;
                            auVar104._4_4_ = fVar48 * fVar4 + auVar106._4_4_;
                            auVar104._8_4_ = fVar48 * fVar5 + auVar106._8_4_;
                            auVar104._12_4_ = fVar48 * fVar6 + auVar106._12_4_;
                            auVar104._16_4_ = fVar48 * fVar7 + auVar106._16_4_;
                            auVar104._20_4_ = fVar48 * fVar8 + auVar106._20_4_;
                            auVar104._24_4_ = fVar48 * fVar9 + auVar106._24_4_;
                            auVar104._28_4_ = fVar48 + auVar106._28_4_;
                            auVar106 = ZEXT3264(auVar104);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 8);
                            auVar88._0_4_ = fVar48 * fVar3 + auVar90._0_4_;
                            auVar88._4_4_ = fVar48 * fVar4 + auVar90._4_4_;
                            auVar88._8_4_ = fVar48 * fVar5 + auVar90._8_4_;
                            auVar88._12_4_ = fVar48 * fVar6 + auVar90._12_4_;
                            auVar88._16_4_ = fVar48 * fVar7 + auVar90._16_4_;
                            auVar88._20_4_ = fVar48 * fVar8 + auVar90._20_4_;
                            auVar88._24_4_ = fVar48 * fVar9 + auVar90._24_4_;
                            auVar88._28_4_ = fVar48 + auVar90._28_4_;
                            auVar90 = ZEXT3264(auVar88);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0xc);
                            auVar68._0_4_ = fVar48 * fVar3 + auVar71._0_4_;
                            auVar68._4_4_ = fVar48 * fVar4 + auVar71._4_4_;
                            auVar68._8_4_ = fVar48 * fVar5 + auVar71._8_4_;
                            auVar68._12_4_ = fVar48 * fVar6 + auVar71._12_4_;
                            auVar68._16_4_ = fVar48 * fVar7 + auVar71._16_4_;
                            auVar68._20_4_ = fVar48 * fVar8 + auVar71._20_4_;
                            auVar68._24_4_ = fVar48 * fVar9 + auVar71._24_4_;
                            auVar68._28_4_ = pfVar24[7] + auVar71._28_4_;
                            auVar71 = ZEXT3264(auVar68);
                            lVar38 = lVar38 + 0x10;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                          pfVar44 = (float *)((long)pfVar44 + lVar38);
                        }
                        if (iVar15 < iVar29) {
                          *pauVar18 = auVar115;
                          pauVar18[1] = auVar104;
                          pauVar18[2] = auVar88;
                          pauVar18[3] = auVar68;
                        }
                        else {
                          if (iVar42 == 8) {
                            *pauVar34 = auVar115;
                            pauVar34[1] = auVar104;
                            pauVar34[2] = auVar88;
                            pauVar34[3] = auVar68;
                            pauVar34 = pauVar34 + 4;
                          }
                          auVar73 = auVar115._0_16_;
                          auVar91 = auVar104._0_16_;
                          auVar74 = auVar88._0_16_;
                          auVar72 = auVar68._0_16_;
                          if (iVar42 == 4) {
                            auVar122._16_16_ = auVar91;
                            auVar122._0_16_ = auVar73;
                            auVar130._16_16_ = auVar72;
                            auVar130._0_16_ = auVar74;
                            auVar66 = vperm2f128_avx(auVar115,auVar104,0x31);
                            auVar86 = vperm2f128_avx(auVar88,auVar68,0x31);
                            *pauVar34 = auVar122;
                            pauVar34[1] = auVar130;
                            *(undefined1 (*) [32])(*pauVar34 + lVar41 * 4) = auVar66;
                            *(undefined1 (*) [32])(pauVar34[1] + lVar41 * 4) = auVar86;
                            pauVar34 = pauVar34 + 2;
                          }
                          if (iVar42 == 1) {
                            auVar84 = vunpcklps_avx(auVar73,auVar91);
                            auVar75 = vunpcklps_avx(auVar74,auVar72);
                            auVar91 = vunpckhps_avx(auVar73,auVar91);
                            auVar73 = vunpckhps_avx(auVar74,auVar72);
                            auVar72 = vmovlhps_avx(auVar84,auVar75);
                            auVar84 = vunpckhpd_avx(auVar84,auVar75);
                            auVar74 = vmovlhps_avx(auVar91,auVar73);
                            auVar75 = vunpckhpd_avx(auVar91,auVar73);
                            auVar73 = vunpcklps_avx(auVar115._16_16_,auVar104._16_16_);
                            auVar92 = vunpcklps_avx(auVar88._16_16_,auVar68._16_16_);
                            auVar107 = vunpckhps_avx(auVar115._16_16_,auVar104._16_16_);
                            auVar117 = vunpckhps_avx(auVar88._16_16_,auVar68._16_16_);
                            auVar91 = vmovlhps_avx(auVar73,auVar92);
                            auVar92 = vunpckhpd_avx(auVar73,auVar92);
                            auVar73 = vmovlhps_avx(auVar107,auVar117);
                            auVar107 = vunpckhpd_avx(auVar107,auVar117);
                            *(undefined1 (*) [16])*pauVar34 = auVar72;
                            *(undefined1 (*) [16])(*pauVar34 + lVar17 * 4) = auVar84;
                            *(undefined1 (*) [16])(*pauVar34 + lVar33 * 4) = auVar74;
                            *(undefined1 (*) [16])(*pauVar34 + local_1d0 * 4) = auVar75;
                            *(undefined1 (*) [16])(*pauVar34 + lVar41 * 4) = auVar91;
                            *(undefined1 (*) [16])(*pauVar34 + local_1d8 * 4) = auVar92;
                            *(undefined1 (*) [16])(*pauVar34 + local_1e0 * 4) = auVar73;
                            *(undefined1 (*) [16])(*pauVar34 + local_168 * 4) = auVar107;
                            pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
                          }
                        }
                        pauVar18 = pauVar18 + 4;
                        uVar22 = uVar36 + 7;
                        uVar36 = uVar36 + 4;
                      }
                      uVar22 = uVar36 | 1;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar71 = ZEXT3264(*pauVar26);
                            auVar90 = ZEXT3264(*pauVar26);
                          }
                        }
                        else {
                          auVar90 = ZEXT3264(*pauVar18);
                          auVar71 = ZEXT3264(pauVar18[1]);
                        }
                        auVar69 = auVar71._0_32_;
                        auVar89 = auVar90._0_32_;
                        if (0 < iVar45) {
                          lVar38 = 0;
                          iVar16 = iVar45;
                          do {
                            pfVar24 = pfVar32 + lVar38;
                            fVar48 = *(float *)((long)pfVar44 + lVar38);
                            auVar89._0_4_ = fVar48 * *pfVar24 + auVar90._0_4_;
                            auVar89._4_4_ = fVar48 * pfVar24[1] + auVar90._4_4_;
                            auVar89._8_4_ = fVar48 * pfVar24[2] + auVar90._8_4_;
                            auVar89._12_4_ = fVar48 * pfVar24[3] + auVar90._12_4_;
                            auVar89._16_4_ = fVar48 * pfVar24[4] + auVar90._16_4_;
                            auVar89._20_4_ = fVar48 * pfVar24[5] + auVar90._20_4_;
                            auVar89._24_4_ = fVar48 * pfVar24[6] + auVar90._24_4_;
                            auVar89._28_4_ = fVar48 + auVar90._28_4_;
                            auVar90 = ZEXT3264(auVar89);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 4);
                            auVar69._0_4_ = fVar48 * *pfVar24 + auVar71._0_4_;
                            auVar69._4_4_ = fVar48 * pfVar24[1] + auVar71._4_4_;
                            auVar69._8_4_ = fVar48 * pfVar24[2] + auVar71._8_4_;
                            auVar69._12_4_ = fVar48 * pfVar24[3] + auVar71._12_4_;
                            auVar69._16_4_ = fVar48 * pfVar24[4] + auVar71._16_4_;
                            auVar69._20_4_ = fVar48 * pfVar24[5] + auVar71._20_4_;
                            auVar69._24_4_ = fVar48 * pfVar24[6] + auVar71._24_4_;
                            auVar69._28_4_ = pfVar24[7] + auVar71._28_4_;
                            auVar71 = ZEXT3264(auVar69);
                            lVar38 = lVar38 + 8;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                          pfVar44 = (float *)((long)pfVar44 + lVar38);
                        }
                        if (iVar15 < iVar29) {
                          *pauVar18 = auVar89;
                          pauVar18[1] = auVar69;
                        }
                        else {
                          if (iVar42 == 8) {
                            *pauVar34 = auVar89;
                            pauVar34[1] = auVar69;
                            pauVar34 = pauVar34 + 2;
                          }
                          auVar74 = auVar89._0_16_;
                          auVar91 = auVar89._16_16_;
                          auVar72 = auVar69._0_16_;
                          if (iVar42 == 4) {
                            auVar105._16_16_ = auVar72;
                            auVar105._0_16_ = auVar74;
                            auVar66 = vperm2f128_avx(auVar89,auVar69,0x31);
                            *pauVar34 = auVar105;
                            *(undefined1 (*) [32])(*pauVar34 + lVar41 * 4) = auVar66;
                            pauVar34 = pauVar34 + 1;
                          }
                          if (iVar42 == 1) {
                            *(int *)*pauVar34 = auVar89._0_4_;
                            uVar25 = vextractps_avx(auVar74,1);
                            *(undefined4 *)(*pauVar34 + lVar17 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar74,2);
                            *(undefined4 *)(*pauVar34 + lVar33 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar74,3);
                            *(undefined4 *)(*pauVar34 + local_80 * 4) = uVar25;
                            *(int *)(*pauVar34 + lVar41 * 4) = auVar89._16_4_;
                            uVar25 = vextractps_avx(auVar91,1);
                            *(undefined4 *)(*pauVar34 + local_88 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar91,2);
                            *(undefined4 *)(*pauVar34 + local_90 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar91,3);
                            *(undefined4 *)(*pauVar34 + local_98 * 4) = uVar25;
                            *(int *)(*pauVar34 + 4) = auVar69._0_4_;
                            uVar25 = vextractps_avx(auVar72,1);
                            *(undefined4 *)(*pauVar34 + local_f8 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar72,2);
                            *(undefined4 *)(*pauVar34 + local_b0 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar72,3);
                            *(undefined4 *)(*pauVar34 + local_b8 * 4) = uVar25;
                            auVar72 = auVar69._16_16_;
                            *(int *)(*pauVar34 + local_c0 * 4) = auVar69._16_4_;
                            uVar25 = vextractps_avx(auVar72,1);
                            *(undefined4 *)(*pauVar34 + local_c8 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar72,2);
                            *(undefined4 *)(*pauVar34 + local_d0 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar72,3);
                            *(undefined4 *)(*pauVar34 + local_d8 * 4) = uVar25;
                            pauVar34 = (undefined1 (*) [32])(*pauVar34 + 8);
                          }
                        }
                        pauVar18 = pauVar18 + 2;
                        uVar22 = uVar36 + 3;
                        uVar36 = uVar36 + 2;
                      }
                      if ((int)uVar36 < (int)uVar21) {
                        do {
                          if (iVar28 == 0) {
                            if (pauVar26 == (undefined1 (*) [32])0x0) {
                              auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              auVar71 = ZEXT3264(*pauVar26);
                            }
                          }
                          else {
                            auVar71 = ZEXT3264(*pauVar18);
                          }
                          auVar70 = auVar71._0_32_;
                          if (0 < iVar45) {
                            lVar38 = 0;
                            iVar16 = iVar45;
                            do {
                              fVar48 = *(float *)((long)pfVar44 + lVar38);
                              pfVar24 = pfVar32 + lVar38 * 2;
                              auVar70._0_4_ = fVar48 * *pfVar24 + auVar71._0_4_;
                              auVar70._4_4_ = fVar48 * pfVar24[1] + auVar71._4_4_;
                              auVar70._8_4_ = fVar48 * pfVar24[2] + auVar71._8_4_;
                              auVar70._12_4_ = fVar48 * pfVar24[3] + auVar71._12_4_;
                              auVar70._16_4_ = fVar48 * pfVar24[4] + auVar71._16_4_;
                              auVar70._20_4_ = fVar48 * pfVar24[5] + auVar71._20_4_;
                              auVar70._24_4_ = fVar48 * pfVar24[6] + auVar71._24_4_;
                              auVar70._28_4_ = fVar48 + auVar71._28_4_;
                              auVar71 = ZEXT3264(auVar70);
                              lVar38 = lVar38 + 4;
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                            pfVar44 = (float *)((long)pfVar44 + lVar38);
                          }
                          if (iVar15 < iVar29) {
                            *pauVar18 = auVar70;
                          }
                          else {
                            if (iVar42 == 8) {
                              *pauVar34 = auVar70;
                              pauVar34 = pauVar34 + 1;
                            }
                            auVar74 = auVar70._16_16_;
                            auVar72 = auVar70._0_16_;
                            if (iVar42 == 4) {
                              *(undefined1 (*) [16])*pauVar34 = auVar72;
                              *(undefined1 (*) [16])(*pauVar34 + lVar41 * 4) = auVar74;
                              pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
                            }
                            if (iVar42 == 1) {
                              *(int *)*pauVar34 = auVar70._0_4_;
                              uVar25 = vextractps_avx(auVar72,1);
                              *(undefined4 *)(*pauVar34 + lVar17 * 4) = uVar25;
                              uVar25 = vextractps_avx(auVar72,2);
                              *(undefined4 *)(*pauVar34 + lVar33 * 4) = uVar25;
                              uVar25 = vextractps_avx(auVar72,3);
                              *(undefined4 *)(*pauVar34 + local_1d0 * 4) = uVar25;
                              *(int *)(*pauVar34 + lVar41 * 4) = auVar70._16_4_;
                              uVar25 = vextractps_avx(auVar74,1);
                              *(undefined4 *)(*pauVar34 + local_1d8 * 4) = uVar25;
                              uVar25 = vextractps_avx(auVar74,2);
                              *(undefined4 *)(*pauVar34 + local_1e0 * 4) = uVar25;
                              uVar25 = vextractps_avx(auVar74,3);
                              *(undefined4 *)(*pauVar34 + local_168 * 4) = uVar25;
                              pauVar34 = (undefined1 (*) [32])(*pauVar34 + 4);
                            }
                          }
                          pauVar18 = pauVar18 + 1;
                          uVar36 = uVar36 + 1;
                        } while (uVar36 != uVar21);
                      }
                      pfVar32 = pfVar32 + iVar45 * 8;
                      uVar23 = local_38 + 8;
                    } while (local_38 + 0xf < local_50);
                  }
                  if ((int)((uint)uVar23 | 3) < (int)local_1c4) {
                    local_168 = (long)(iVar42 * iVar14);
                    lVar17 = (long)iVar30;
                    lVar33 = (long)(iVar30 * 2);
                    lVar41 = (long)(local_a0 * 0x300000000) >> 0x20;
                    local_1d0 = (ulong)(iVar30 * 2 + 1);
                    local_1d8 = (long)(iVar30 * 3 + 1);
                    local_f8 = (long)(iVar45 * 4) * 4;
                    uVar23 = uVar23 & 0xffffffff;
                    pauVar34 = pauVar26;
                    do {
                      local_1e0 = uVar23;
                      pauVar26 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 local_1e0 * 4 + local_108 * 4);
                      if (pauVar34 == (undefined1 (*) [32])0x0) {
                        pauVar26 = pauVar34;
                      }
                      uVar36 = 0;
                      pauVar19 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 local_168 * 4 + (local_1e0 + local_108) * lVar17 * 4);
                      pfVar44 = local_1c0;
                      if (0xb < (int)uVar21) {
                        uVar22 = 0;
                        do {
                          if (iVar28 == 0) {
                            if (pauVar26 == (undefined1 (*) [32])0x0) {
                              auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar139 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar156 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              auVar72 = *(undefined1 (*) [16])*pauVar26;
                              auVar71 = ZEXT1664(auVar72);
                              auVar90 = ZEXT1664(auVar72);
                              auVar106 = ZEXT1664(auVar72);
                              auVar116 = ZEXT1664(auVar72);
                              auVar123 = ZEXT1664(auVar72);
                              auVar131 = ZEXT1664(auVar72);
                              auVar139 = ZEXT1664(auVar72);
                              auVar145 = ZEXT1664(auVar72);
                              auVar149 = ZEXT1664(auVar72);
                              auVar156 = ZEXT1664(auVar72);
                              auVar163 = ZEXT1664(auVar72);
                              auVar170 = ZEXT1664(auVar72);
                            }
                          }
                          else {
                            auVar170 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                            auVar163 = ZEXT1664(*(undefined1 (*) [16])(*pauVar18 + 0x10));
                            auVar156 = ZEXT1664(*(undefined1 (*) [16])pauVar18[1]);
                            auVar149 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[1] + 0x10));
                            auVar145 = ZEXT1664(*(undefined1 (*) [16])pauVar18[2]);
                            auVar139 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[2] + 0x10));
                            auVar131 = ZEXT1664(*(undefined1 (*) [16])pauVar18[3]);
                            auVar123 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[3] + 0x10));
                            auVar116 = ZEXT1664(*(undefined1 (*) [16])pauVar18[4]);
                            auVar106 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[4] + 0x10));
                            auVar90 = ZEXT1664(*(undefined1 (*) [16])pauVar18[5]);
                            auVar71 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[5] + 0x10));
                          }
                          auVar72 = auVar71._0_16_;
                          auVar75 = auVar90._0_16_;
                          auVar92 = auVar106._0_16_;
                          auVar107 = auVar116._0_16_;
                          auVar117 = auVar123._0_16_;
                          auVar124 = auVar131._0_16_;
                          auVar132 = auVar139._0_16_;
                          auVar140 = auVar145._0_16_;
                          auVar146 = auVar149._0_16_;
                          auVar150 = auVar156._0_16_;
                          auVar157 = auVar163._0_16_;
                          auVar164 = auVar170._0_16_;
                          pfVar24 = pfVar32;
                          iVar16 = iVar45;
                          if (0 < iVar45) {
                            do {
                              fVar3 = *pfVar24;
                              fVar4 = pfVar24[1];
                              fVar5 = pfVar24[2];
                              fVar6 = pfVar24[3];
                              fVar48 = *pfVar44;
                              auVar164._0_4_ = fVar48 * fVar3 + auVar170._0_4_;
                              auVar164._4_4_ = fVar48 * fVar4 + auVar170._4_4_;
                              auVar164._8_4_ = fVar48 * fVar5 + auVar170._8_4_;
                              auVar164._12_4_ = fVar48 * fVar6 + auVar170._12_4_;
                              auVar170 = ZEXT1664(auVar164);
                              fVar48 = pfVar44[1];
                              auVar157._0_4_ = fVar48 * fVar3 + auVar163._0_4_;
                              auVar157._4_4_ = fVar48 * fVar4 + auVar163._4_4_;
                              auVar157._8_4_ = fVar48 * fVar5 + auVar163._8_4_;
                              auVar157._12_4_ = fVar48 * fVar6 + auVar163._12_4_;
                              auVar163 = ZEXT1664(auVar157);
                              fVar48 = pfVar44[2];
                              auVar150._0_4_ = fVar48 * fVar3 + auVar156._0_4_;
                              auVar150._4_4_ = fVar48 * fVar4 + auVar156._4_4_;
                              auVar150._8_4_ = fVar48 * fVar5 + auVar156._8_4_;
                              auVar150._12_4_ = fVar48 * fVar6 + auVar156._12_4_;
                              auVar156 = ZEXT1664(auVar150);
                              fVar48 = pfVar44[3];
                              auVar146._0_4_ = fVar48 * fVar3 + auVar149._0_4_;
                              auVar146._4_4_ = fVar48 * fVar4 + auVar149._4_4_;
                              auVar146._8_4_ = fVar48 * fVar5 + auVar149._8_4_;
                              auVar146._12_4_ = fVar48 * fVar6 + auVar149._12_4_;
                              auVar149 = ZEXT1664(auVar146);
                              fVar48 = pfVar44[4];
                              auVar140._0_4_ = fVar48 * fVar3 + auVar145._0_4_;
                              auVar140._4_4_ = fVar48 * fVar4 + auVar145._4_4_;
                              auVar140._8_4_ = fVar48 * fVar5 + auVar145._8_4_;
                              auVar140._12_4_ = fVar48 * fVar6 + auVar145._12_4_;
                              auVar145 = ZEXT1664(auVar140);
                              fVar48 = pfVar44[5];
                              auVar132._0_4_ = fVar48 * fVar3 + auVar139._0_4_;
                              auVar132._4_4_ = fVar48 * fVar4 + auVar139._4_4_;
                              auVar132._8_4_ = fVar48 * fVar5 + auVar139._8_4_;
                              auVar132._12_4_ = fVar48 * fVar6 + auVar139._12_4_;
                              auVar139 = ZEXT1664(auVar132);
                              fVar48 = pfVar44[6];
                              auVar124._0_4_ = fVar48 * fVar3 + auVar131._0_4_;
                              auVar124._4_4_ = fVar48 * fVar4 + auVar131._4_4_;
                              auVar124._8_4_ = fVar48 * fVar5 + auVar131._8_4_;
                              auVar124._12_4_ = fVar48 * fVar6 + auVar131._12_4_;
                              auVar131 = ZEXT1664(auVar124);
                              fVar48 = pfVar44[7];
                              auVar117._0_4_ = fVar48 * fVar3 + auVar123._0_4_;
                              auVar117._4_4_ = fVar48 * fVar4 + auVar123._4_4_;
                              auVar117._8_4_ = fVar48 * fVar5 + auVar123._8_4_;
                              auVar117._12_4_ = fVar48 * fVar6 + auVar123._12_4_;
                              auVar123 = ZEXT1664(auVar117);
                              fVar48 = pfVar44[8];
                              auVar107._0_4_ = fVar48 * fVar3 + auVar116._0_4_;
                              auVar107._4_4_ = fVar48 * fVar4 + auVar116._4_4_;
                              auVar107._8_4_ = fVar48 * fVar5 + auVar116._8_4_;
                              auVar107._12_4_ = fVar48 * fVar6 + auVar116._12_4_;
                              auVar116 = ZEXT1664(auVar107);
                              fVar48 = pfVar44[9];
                              auVar92._0_4_ = fVar48 * fVar3 + auVar106._0_4_;
                              auVar92._4_4_ = fVar48 * fVar4 + auVar106._4_4_;
                              auVar92._8_4_ = fVar48 * fVar5 + auVar106._8_4_;
                              auVar92._12_4_ = fVar48 * fVar6 + auVar106._12_4_;
                              auVar106 = ZEXT1664(auVar92);
                              fVar48 = pfVar44[10];
                              auVar75._0_4_ = fVar48 * fVar3 + auVar90._0_4_;
                              auVar75._4_4_ = fVar48 * fVar4 + auVar90._4_4_;
                              auVar75._8_4_ = fVar48 * fVar5 + auVar90._8_4_;
                              auVar75._12_4_ = fVar48 * fVar6 + auVar90._12_4_;
                              auVar90 = ZEXT1664(auVar75);
                              fVar48 = pfVar44[0xb];
                              auVar72._0_4_ = fVar48 * fVar3 + auVar71._0_4_;
                              auVar72._4_4_ = fVar48 * fVar4 + auVar71._4_4_;
                              auVar72._8_4_ = fVar48 * fVar5 + auVar71._8_4_;
                              auVar72._12_4_ = fVar48 * fVar6 + auVar71._12_4_;
                              auVar71 = ZEXT1664(auVar72);
                              pfVar44 = pfVar44 + 0xc;
                              iVar16 = iVar16 + -1;
                              pfVar24 = pfVar24 + 4;
                            } while (iVar16 != 0);
                          }
                          if (iVar15 < iVar29) {
                            *(undefined1 (*) [16])*pauVar18 = auVar164;
                            *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar157;
                            *(undefined1 (*) [16])pauVar18[1] = auVar150;
                            *(undefined1 (*) [16])(pauVar18[1] + 0x10) = auVar146;
                            *(undefined1 (*) [16])pauVar18[2] = auVar140;
                            *(undefined1 (*) [16])(pauVar18[2] + 0x10) = auVar132;
                            *(undefined1 (*) [16])pauVar18[3] = auVar124;
                            *(undefined1 (*) [16])(pauVar18[3] + 0x10) = auVar117;
                            *(undefined1 (*) [16])pauVar18[4] = auVar107;
                            *(undefined1 (*) [16])(pauVar18[4] + 0x10) = auVar92;
                            *(undefined1 (*) [16])pauVar18[5] = auVar75;
                            *(undefined1 (*) [16])(pauVar18[5] + 0x10) = auVar72;
                          }
                          else {
                            if (iVar42 == 4) {
                              *pauVar19 = auVar164;
                              pauVar19[1] = auVar157;
                              pauVar19[2] = auVar150;
                              pauVar19[3] = auVar146;
                              pauVar19[4] = auVar140;
                              pauVar19[5] = auVar132;
                              pauVar19[6] = auVar124;
                              pauVar19[7] = auVar117;
                              pauVar19[8] = auVar107;
                              pauVar19[9] = auVar92;
                              pauVar19[10] = auVar75;
                              pauVar19[0xb] = auVar72;
                              pauVar19 = pauVar19 + 0xc;
                            }
                            if (iVar42 == 1) {
                              auVar91 = vunpcklps_avx(auVar164,auVar157);
                              auVar49 = vunpcklps_avx(auVar150,auVar146);
                              auVar73 = vunpckhps_avx(auVar164,auVar157);
                              auVar84 = vunpckhps_avx(auVar150,auVar146);
                              auVar74 = vmovlhps_avx(auVar91,auVar49);
                              auVar146 = vunpckhpd_avx(auVar91,auVar49);
                              auVar91 = vmovlhps_avx(auVar73,auVar84);
                              auVar150 = vunpckhpd_avx(auVar73,auVar84);
                              auVar84 = vunpcklps_avx(auVar140,auVar132);
                              auVar157 = vunpcklps_avx(auVar124,auVar117);
                              auVar132 = vunpckhps_avx(auVar140,auVar132);
                              auVar124 = vunpckhps_avx(auVar124,auVar117);
                              auVar73 = vmovlhps_avx(auVar84,auVar157);
                              auVar117 = vunpckhpd_avx(auVar84,auVar157);
                              auVar84 = vmovlhps_avx(auVar132,auVar124);
                              auVar124 = vunpckhpd_avx(auVar132,auVar124);
                              auVar140 = vunpcklps_avx(auVar107,auVar92);
                              auVar157 = vunpcklps_avx(auVar75,auVar72);
                              auVar107 = vunpckhps_avx(auVar107,auVar92);
                              auVar132 = vunpckhps_avx(auVar75,auVar72);
                              auVar72 = vmovlhps_avx(auVar140,auVar157);
                              auVar92 = vunpckhpd_avx(auVar140,auVar157);
                              auVar75 = vmovlhps_avx(auVar107,auVar132);
                              auVar107 = vunpckhpd_avx(auVar107,auVar132);
                              *pauVar19 = auVar74;
                              *(undefined1 (*) [16])(*pauVar19 + lVar17 * 4) = auVar146;
                              *(undefined1 (*) [16])(*pauVar19 + lVar33 * 4) = auVar91;
                              *(undefined1 (*) [16])(*pauVar19 + lVar41 * 4) = auVar150;
                              pauVar19[1] = auVar73;
                              *(undefined1 (*) [16])(pauVar19[1] + lVar17 * 4) = auVar117;
                              *(undefined1 (*) [16])(pauVar19[1] + lVar33 * 4) = auVar84;
                              *(undefined1 (*) [16])(pauVar19[1] + lVar41 * 4) = auVar124;
                              pauVar19[2] = auVar72;
                              *(undefined1 (*) [16])(pauVar19[2] + lVar17 * 4) = auVar92;
                              *(undefined1 (*) [16])(pauVar19[2] + lVar33 * 4) = auVar75;
                              *(undefined1 (*) [16])(pauVar19[2] + lVar41 * 4) = auVar107;
                              pauVar19 = pauVar19 + 3;
                            }
                          }
                          pauVar18 = pauVar18 + 6;
                          uVar36 = uVar22 + 0xc;
                          iVar16 = uVar22 + 0x17;
                          uVar22 = uVar36;
                        } while (iVar16 < (int)uVar21);
                      }
                      iVar16 = uVar36 + 7;
                      while (iVar16 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar139 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar145 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar72 = *(undefined1 (*) [16])*pauVar26;
                            auVar71 = ZEXT1664(auVar72);
                            auVar90 = ZEXT1664(auVar72);
                            auVar106 = ZEXT1664(auVar72);
                            auVar116 = ZEXT1664(auVar72);
                            auVar123 = ZEXT1664(auVar72);
                            auVar131 = ZEXT1664(auVar72);
                            auVar139 = ZEXT1664(auVar72);
                            auVar145 = ZEXT1664(auVar72);
                          }
                        }
                        else {
                          auVar145 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                          auVar139 = ZEXT1664(*(undefined1 (*) [16])(*pauVar18 + 0x10));
                          auVar131 = ZEXT1664(*(undefined1 (*) [16])pauVar18[1]);
                          auVar123 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[1] + 0x10));
                          auVar71 = ZEXT1664(*(undefined1 (*) [16])pauVar18[2]);
                          auVar90 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[2] + 0x10));
                          auVar106 = ZEXT1664(*(undefined1 (*) [16])pauVar18[3]);
                          auVar116 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[3] + 0x10));
                        }
                        auVar108 = auVar116._0_16_;
                        auVar93 = auVar106._0_16_;
                        auVar76 = auVar90._0_16_;
                        auVar49 = auVar71._0_16_;
                        auVar118 = auVar123._0_16_;
                        auVar125 = auVar131._0_16_;
                        auVar133 = auVar139._0_16_;
                        auVar141 = auVar145._0_16_;
                        pfVar24 = pfVar32;
                        iVar16 = iVar45;
                        if (0 < iVar45) {
                          do {
                            fVar3 = *pfVar24;
                            fVar4 = pfVar24[1];
                            fVar5 = pfVar24[2];
                            fVar6 = pfVar24[3];
                            fVar48 = *pfVar44;
                            auVar141._0_4_ = fVar48 * fVar3 + auVar145._0_4_;
                            auVar141._4_4_ = fVar48 * fVar4 + auVar145._4_4_;
                            auVar141._8_4_ = fVar48 * fVar5 + auVar145._8_4_;
                            auVar141._12_4_ = fVar48 * fVar6 + auVar145._12_4_;
                            auVar145 = ZEXT1664(auVar141);
                            fVar48 = pfVar44[1];
                            auVar133._0_4_ = fVar48 * fVar3 + auVar139._0_4_;
                            auVar133._4_4_ = fVar48 * fVar4 + auVar139._4_4_;
                            auVar133._8_4_ = fVar48 * fVar5 + auVar139._8_4_;
                            auVar133._12_4_ = fVar48 * fVar6 + auVar139._12_4_;
                            auVar139 = ZEXT1664(auVar133);
                            fVar48 = pfVar44[2];
                            auVar125._0_4_ = fVar48 * fVar3 + auVar131._0_4_;
                            auVar125._4_4_ = fVar48 * fVar4 + auVar131._4_4_;
                            auVar125._8_4_ = fVar48 * fVar5 + auVar131._8_4_;
                            auVar125._12_4_ = fVar48 * fVar6 + auVar131._12_4_;
                            auVar131 = ZEXT1664(auVar125);
                            fVar48 = pfVar44[3];
                            auVar118._0_4_ = fVar48 * fVar3 + auVar123._0_4_;
                            auVar118._4_4_ = fVar48 * fVar4 + auVar123._4_4_;
                            auVar118._8_4_ = fVar48 * fVar5 + auVar123._8_4_;
                            auVar118._12_4_ = fVar48 * fVar6 + auVar123._12_4_;
                            auVar123 = ZEXT1664(auVar118);
                            fVar48 = pfVar44[4];
                            auVar49._0_4_ = fVar48 * fVar3 + auVar71._0_4_;
                            auVar49._4_4_ = fVar48 * fVar4 + auVar71._4_4_;
                            auVar49._8_4_ = fVar48 * fVar5 + auVar71._8_4_;
                            auVar49._12_4_ = fVar48 * fVar6 + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar49);
                            fVar48 = pfVar44[5];
                            auVar76._0_4_ = fVar48 * fVar3 + auVar90._0_4_;
                            auVar76._4_4_ = fVar48 * fVar4 + auVar90._4_4_;
                            auVar76._8_4_ = fVar48 * fVar5 + auVar90._8_4_;
                            auVar76._12_4_ = fVar48 * fVar6 + auVar90._12_4_;
                            auVar90 = ZEXT1664(auVar76);
                            fVar48 = pfVar44[6];
                            auVar93._0_4_ = fVar48 * fVar3 + auVar106._0_4_;
                            auVar93._4_4_ = fVar48 * fVar4 + auVar106._4_4_;
                            auVar93._8_4_ = fVar48 * fVar5 + auVar106._8_4_;
                            auVar93._12_4_ = fVar48 * fVar6 + auVar106._12_4_;
                            auVar106 = ZEXT1664(auVar93);
                            fVar48 = pfVar44[7];
                            auVar108._0_4_ = fVar48 * fVar3 + auVar116._0_4_;
                            auVar108._4_4_ = fVar48 * fVar4 + auVar116._4_4_;
                            auVar108._8_4_ = fVar48 * fVar5 + auVar116._8_4_;
                            auVar108._12_4_ = fVar48 * fVar6 + auVar116._12_4_;
                            auVar116 = ZEXT1664(auVar108);
                            pfVar44 = pfVar44 + 8;
                            iVar16 = iVar16 + -1;
                            pfVar24 = pfVar24 + 4;
                          } while (iVar16 != 0);
                        }
                        if (iVar15 < iVar29) {
                          *(undefined1 (*) [16])*pauVar18 = auVar141;
                          *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar133;
                          *(undefined1 (*) [16])pauVar18[1] = auVar125;
                          *(undefined1 (*) [16])(pauVar18[1] + 0x10) = auVar118;
                          *(undefined1 (*) [16])pauVar18[2] = auVar49;
                          *(undefined1 (*) [16])(pauVar18[2] + 0x10) = auVar76;
                          *(undefined1 (*) [16])pauVar18[3] = auVar93;
                          *(undefined1 (*) [16])(pauVar18[3] + 0x10) = auVar108;
                        }
                        else {
                          if (iVar42 == 4) {
                            *pauVar19 = auVar141;
                            pauVar19[1] = auVar133;
                            pauVar19[2] = auVar125;
                            pauVar19[3] = auVar118;
                            pauVar19[4] = auVar49;
                            pauVar19[5] = auVar76;
                            pauVar19[6] = auVar93;
                            pauVar19[7] = auVar108;
                            pauVar19 = pauVar19 + 8;
                          }
                          if (iVar42 == 1) {
                            auVar74 = vunpcklps_avx(auVar141,auVar133);
                            auVar84 = vunpcklps_avx(auVar125,auVar118);
                            auVar91 = vunpckhps_avx(auVar141,auVar133);
                            auVar73 = vunpckhps_avx(auVar125,auVar118);
                            auVar72 = vmovlhps_avx(auVar74,auVar84);
                            auVar84 = vunpckhpd_avx(auVar74,auVar84);
                            auVar74 = vmovlhps_avx(auVar91,auVar73);
                            auVar75 = vunpckhpd_avx(auVar91,auVar73);
                            auVar73 = vunpcklps_avx(auVar49,auVar76);
                            auVar92 = vunpcklps_avx(auVar93,auVar108);
                            auVar107 = vunpckhps_avx(auVar49,auVar76);
                            auVar117 = vunpckhps_avx(auVar93,auVar108);
                            auVar91 = vmovlhps_avx(auVar73,auVar92);
                            auVar92 = vunpckhpd_avx(auVar73,auVar92);
                            auVar73 = vmovlhps_avx(auVar107,auVar117);
                            auVar107 = vunpckhpd_avx(auVar107,auVar117);
                            *pauVar19 = auVar72;
                            *(undefined1 (*) [16])(*pauVar19 + lVar17 * 4) = auVar84;
                            *(undefined1 (*) [16])(*pauVar19 + lVar33 * 4) = auVar74;
                            *(undefined1 (*) [16])(*pauVar19 + lVar41 * 4) = auVar75;
                            pauVar19[1] = auVar91;
                            *(undefined1 (*) [16])(pauVar19[1] + lVar17 * 4) = auVar92;
                            *(undefined1 (*) [16])(pauVar19[1] + lVar33 * 4) = auVar73;
                            *(undefined1 (*) [16])(pauVar19[1] + lVar41 * 4) = auVar107;
                            pauVar19 = pauVar19 + 2;
                          }
                        }
                        pauVar18 = pauVar18 + 4;
                        iVar16 = uVar36 + 0xf;
                        uVar36 = uVar36 + 8;
                      }
                      uVar22 = uVar36 | 3;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar72 = *(undefined1 (*) [16])*pauVar26;
                            auVar71 = ZEXT1664(auVar72);
                            auVar90 = ZEXT1664(auVar72);
                            auVar106 = ZEXT1664(auVar72);
                            auVar116 = ZEXT1664(auVar72);
                          }
                        }
                        else {
                          auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                          auVar90 = ZEXT1664(*(undefined1 (*) [16])(*pauVar18 + 0x10));
                          auVar106 = ZEXT1664(*(undefined1 (*) [16])pauVar18[1]);
                          auVar116 = ZEXT1664(*(undefined1 (*) [16])(pauVar18[1] + 0x10));
                        }
                        auVar109 = auVar116._0_16_;
                        auVar94 = auVar106._0_16_;
                        auVar77 = auVar90._0_16_;
                        auVar50 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar38 = 0;
                          iVar16 = iVar45;
                          do {
                            pfVar24 = (float *)((long)pfVar32 + lVar38);
                            fVar3 = *pfVar24;
                            fVar4 = pfVar24[1];
                            fVar5 = pfVar24[2];
                            fVar6 = pfVar24[3];
                            fVar48 = *(float *)((long)pfVar44 + lVar38);
                            auVar50._0_4_ = fVar48 * fVar3 + auVar71._0_4_;
                            auVar50._4_4_ = fVar48 * fVar4 + auVar71._4_4_;
                            auVar50._8_4_ = fVar48 * fVar5 + auVar71._8_4_;
                            auVar50._12_4_ = fVar48 * fVar6 + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar50);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 4);
                            auVar77._0_4_ = fVar48 * fVar3 + auVar90._0_4_;
                            auVar77._4_4_ = fVar48 * fVar4 + auVar90._4_4_;
                            auVar77._8_4_ = fVar48 * fVar5 + auVar90._8_4_;
                            auVar77._12_4_ = fVar48 * fVar6 + auVar90._12_4_;
                            auVar90 = ZEXT1664(auVar77);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 8);
                            auVar94._0_4_ = fVar48 * fVar3 + auVar106._0_4_;
                            auVar94._4_4_ = fVar48 * fVar4 + auVar106._4_4_;
                            auVar94._8_4_ = fVar48 * fVar5 + auVar106._8_4_;
                            auVar94._12_4_ = fVar48 * fVar6 + auVar106._12_4_;
                            auVar106 = ZEXT1664(auVar94);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 0xc);
                            auVar109._0_4_ = fVar48 * fVar3 + auVar116._0_4_;
                            auVar109._4_4_ = fVar48 * fVar4 + auVar116._4_4_;
                            auVar109._8_4_ = fVar48 * fVar5 + auVar116._8_4_;
                            auVar109._12_4_ = fVar48 * fVar6 + auVar116._12_4_;
                            auVar116 = ZEXT1664(auVar109);
                            lVar38 = lVar38 + 0x10;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                          pfVar44 = (float *)((long)pfVar44 + lVar38);
                        }
                        if (iVar15 < iVar29) {
                          *(undefined1 (*) [16])*pauVar18 = auVar50;
                          *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar77;
                          *(undefined1 (*) [16])pauVar18[1] = auVar94;
                          *(undefined1 (*) [16])(pauVar18[1] + 0x10) = auVar109;
                        }
                        else {
                          if (iVar42 == 4) {
                            *pauVar19 = auVar50;
                            pauVar19[1] = auVar77;
                            pauVar19[2] = auVar94;
                            pauVar19[3] = auVar109;
                            pauVar19 = pauVar19 + 4;
                          }
                          if (iVar42 == 1) {
                            auVar74 = vunpcklps_avx(auVar50,auVar77);
                            auVar91 = vunpcklps_avx(auVar94,auVar109);
                            auVar73 = vunpckhps_avx(auVar50,auVar77);
                            auVar84 = vunpckhps_avx(auVar94,auVar109);
                            auVar72 = vmovlhps_avx(auVar74,auVar91);
                            auVar91 = vunpckhpd_avx(auVar74,auVar91);
                            auVar74 = vmovlhps_avx(auVar73,auVar84);
                            auVar73 = vunpckhpd_avx(auVar73,auVar84);
                            *pauVar19 = auVar72;
                            *(undefined1 (*) [16])(*pauVar19 + lVar17 * 4) = auVar91;
                            *(undefined1 (*) [16])(*pauVar19 + lVar33 * 4) = auVar74;
                            *(undefined1 (*) [16])(*pauVar19 + lVar41 * 4) = auVar73;
                            pauVar19 = pauVar19 + 1;
                          }
                        }
                        pauVar18 = pauVar18 + 2;
                        uVar22 = uVar36 + 7;
                        uVar36 = uVar36 + 4;
                      }
                      uVar22 = uVar36 | 1;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar90 = ZEXT1664(*(undefined1 (*) [16])*pauVar26);
                            auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar26);
                          }
                        }
                        else {
                          auVar90 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                          auVar71 = ZEXT1664(*(undefined1 (*) [16])(*pauVar18 + 0x10));
                        }
                        auVar51 = auVar71._0_16_;
                        auVar78 = auVar90._0_16_;
                        if (0 < iVar45) {
                          lVar38 = 0;
                          iVar16 = iVar45;
                          do {
                            pfVar24 = (float *)((long)pfVar32 + lVar38 * 2);
                            fVar48 = *(float *)((long)pfVar44 + lVar38);
                            auVar78._0_4_ = fVar48 * *pfVar24 + auVar90._0_4_;
                            auVar78._4_4_ = fVar48 * pfVar24[1] + auVar90._4_4_;
                            auVar78._8_4_ = fVar48 * pfVar24[2] + auVar90._8_4_;
                            auVar78._12_4_ = fVar48 * pfVar24[3] + auVar90._12_4_;
                            auVar90 = ZEXT1664(auVar78);
                            fVar48 = *(float *)((long)pfVar44 + lVar38 + 4);
                            auVar51._0_4_ = fVar48 * *pfVar24 + auVar71._0_4_;
                            auVar51._4_4_ = fVar48 * pfVar24[1] + auVar71._4_4_;
                            auVar51._8_4_ = fVar48 * pfVar24[2] + auVar71._8_4_;
                            auVar51._12_4_ = fVar48 * pfVar24[3] + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar51);
                            lVar38 = lVar38 + 8;
                            iVar16 = iVar16 + -1;
                          } while (iVar16 != 0);
                          pfVar44 = (float *)((long)pfVar44 + lVar38);
                        }
                        if (iVar15 < iVar29) {
                          *(undefined1 (*) [16])*pauVar18 = auVar78;
                          *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar51;
                        }
                        else {
                          if (iVar42 == 4) {
                            *pauVar19 = auVar78;
                            pauVar19[1] = auVar51;
                            pauVar19 = pauVar19 + 2;
                          }
                          if (iVar42 == 1) {
                            *(int *)*pauVar19 = auVar78._0_4_;
                            uVar25 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar19 + lVar17 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar19 + lVar33 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar19 + (long)(iVar30 * 3) * 4) = uVar25;
                            *(int *)(*pauVar19 + 4) = auVar51._0_4_;
                            uVar25 = vextractps_avx(auVar51,1);
                            *(undefined4 *)
                             (*pauVar19 + ((long)((local_a0 << 0x20) + 0x100000000) >> 0x20) * 4) =
                                 uVar25;
                            uVar25 = vextractps_avx(auVar51,2);
                            *(undefined4 *)(*pauVar19 + local_1d0 * 4) = uVar25;
                            uVar25 = vextractps_avx(auVar51,3);
                            *(undefined4 *)(*pauVar19 + local_1d8 * 4) = uVar25;
                            pauVar19 = (undefined1 (*) [16])(*pauVar19 + 8);
                          }
                        }
                        pauVar18 = pauVar18 + 1;
                        uVar22 = uVar36 + 3;
                        uVar36 = uVar36 + 2;
                      }
                      if ((int)uVar36 < (int)uVar21) {
                        do {
                          if (iVar28 == 0) {
                            if (pauVar26 == (undefined1 (*) [32])0x0) {
                              auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar26);
                            }
                          }
                          else {
                            auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                          }
                          auVar52 = auVar71._0_16_;
                          if (0 < iVar45) {
                            lVar38 = 0;
                            iVar16 = iVar45;
                            do {
                              fVar48 = *(float *)((long)pfVar44 + lVar38);
                              pfVar24 = pfVar32 + lVar38;
                              auVar52._0_4_ = fVar48 * *pfVar24 + auVar71._0_4_;
                              auVar52._4_4_ = fVar48 * pfVar24[1] + auVar71._4_4_;
                              auVar52._8_4_ = fVar48 * pfVar24[2] + auVar71._8_4_;
                              auVar52._12_4_ = fVar48 * pfVar24[3] + auVar71._12_4_;
                              auVar71 = ZEXT1664(auVar52);
                              lVar38 = lVar38 + 4;
                              iVar16 = iVar16 + -1;
                            } while (iVar16 != 0);
                            pfVar44 = (float *)((long)pfVar44 + lVar38);
                          }
                          if (iVar15 < iVar29) {
                            *(undefined1 (*) [16])*pauVar18 = auVar52;
                          }
                          else {
                            if (iVar42 == 4) {
                              *pauVar19 = auVar52;
                              pauVar19 = pauVar19 + 1;
                            }
                            if (iVar42 == 1) {
                              *(int *)*pauVar19 = auVar52._0_4_;
                              uVar25 = vextractps_avx(auVar52,1);
                              *(undefined4 *)(*pauVar19 + lVar17 * 4) = uVar25;
                              uVar25 = vextractps_avx(auVar52,2);
                              *(undefined4 *)(*pauVar19 + lVar33 * 4) = uVar25;
                              uVar25 = vextractps_avx(auVar52,3);
                              *(undefined4 *)(*pauVar19 + lVar41 * 4) = uVar25;
                              pauVar19 = (undefined1 (*) [16])(*pauVar19 + 4);
                            }
                          }
                          pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                          uVar36 = uVar36 + 1;
                        } while (uVar36 != uVar21);
                      }
                      pfVar32 = pfVar32 + iVar45 * 4;
                      uVar23 = local_1e0 + 4;
                      pauVar34 = pauVar26;
                    } while ((long)(local_1e0 + 7) < local_100);
                  }
                  if ((int)((uint)uVar23 | 1) < (int)local_1c4) {
                    lVar17 = (long)iVar30;
                    lVar41 = (long)local_74;
                    pauVar34 = pauVar26;
                    uVar184 = uVar23 & 0xffffffff;
                    iVar42 = local_74;
                    if (local_58 < local_74) {
                      lVar41 = local_58;
                      iVar42 = TILE_K;
                    }
                    do {
                      pauVar26 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 uVar184 * 4 + local_108 * 4);
                      if (pauVar34 == (undefined1 (*) [32])0x0) {
                        pauVar26 = pauVar34;
                      }
                      uVar36 = 0;
                      pauVar19 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 local_e0 * 4 + (uVar184 + local_108) * lVar17 * 4);
                      pfVar44 = local_1c0;
                      if (0xb < (int)uVar21) {
                        uVar22 = 0;
                        do {
                          if (iVar28 == 0) {
                            if (pauVar26 == (undefined1 (*) [32])0x0) {
                              auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar123 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              uVar25 = *(undefined4 *)*pauVar26;
                              auVar53._4_4_ = uVar25;
                              auVar53._0_4_ = uVar25;
                              auVar53._8_4_ = uVar25;
                              auVar53._12_4_ = uVar25;
                              auVar71 = ZEXT1664(auVar53);
                              uVar25 = *(undefined4 *)(*pauVar26 + 4);
                              auVar110._4_4_ = uVar25;
                              auVar110._0_4_ = uVar25;
                              auVar110._8_4_ = uVar25;
                              auVar110._12_4_ = uVar25;
                              auVar116 = ZEXT1664(auVar110);
                              auVar90 = ZEXT1664(auVar53);
                              auVar106 = ZEXT1664(auVar53);
                              auVar123 = ZEXT1664(auVar110);
                              auVar131 = ZEXT1664(auVar110);
                            }
                          }
                          else {
                            auVar72 = vshufps_avx(*(undefined1 (*) [16])*pauVar18,
                                                  *(undefined1 (*) [16])(*pauVar18 + 0x10),0x88);
                            auVar71 = ZEXT1664(auVar72);
                            auVar72 = vshufps_avx(*(undefined1 (*) [16])pauVar18[1],
                                                  *(undefined1 (*) [16])(pauVar18[1] + 0x10),0x88);
                            auVar90 = ZEXT1664(auVar72);
                            auVar72 = vshufps_avx(*(undefined1 (*) [16])pauVar18[2],
                                                  *(undefined1 (*) [16])(pauVar18[2] + 0x10),0x88);
                            auVar106 = ZEXT1664(auVar72);
                            auVar72 = vshufps_avx(*(undefined1 (*) [16])*pauVar18,
                                                  *(undefined1 (*) [16])(*pauVar18 + 0x10),0xdd);
                            auVar116 = ZEXT1664(auVar72);
                            auVar72 = vshufps_avx(*(undefined1 (*) [16])pauVar18[1],
                                                  *(undefined1 (*) [16])(pauVar18[1] + 0x10),0xdd);
                            auVar123 = ZEXT1664(auVar72);
                            auVar72 = vshufps_avx(*(undefined1 (*) [16])pauVar18[2],
                                                  *(undefined1 (*) [16])(pauVar18[2] + 0x10),0xdd);
                            auVar131 = ZEXT1664(auVar72);
                          }
                          auVar126 = auVar131._0_16_;
                          auVar95 = auVar106._0_16_;
                          auVar119 = auVar123._0_16_;
                          auVar79 = auVar90._0_16_;
                          auVar111 = auVar116._0_16_;
                          auVar54 = auVar71._0_16_;
                          if (0 < iVar45) {
                            lVar33 = 0;
                            do {
                              auVar72 = *(undefined1 (*) [16])(pfVar44 + 4);
                              auVar74 = *(undefined1 (*) [16])(pfVar44 + 8);
                              fVar48 = pfVar32[lVar33 * 2];
                              auVar54._0_4_ = fVar48 * *pfVar44 + auVar71._0_4_;
                              auVar54._4_4_ = fVar48 * pfVar44[1] + auVar71._4_4_;
                              auVar54._8_4_ = fVar48 * pfVar44[2] + auVar71._8_4_;
                              auVar54._12_4_ = fVar48 * pfVar44[3] + auVar71._12_4_;
                              auVar71 = ZEXT1664(auVar54);
                              auVar79._0_4_ = fVar48 * auVar72._0_4_ + auVar90._0_4_;
                              auVar79._4_4_ = fVar48 * auVar72._4_4_ + auVar90._4_4_;
                              auVar79._8_4_ = fVar48 * auVar72._8_4_ + auVar90._8_4_;
                              auVar79._12_4_ = fVar48 * auVar72._12_4_ + auVar90._12_4_;
                              auVar90 = ZEXT1664(auVar79);
                              auVar95._0_4_ = fVar48 * auVar74._0_4_ + auVar106._0_4_;
                              auVar95._4_4_ = fVar48 * auVar74._4_4_ + auVar106._4_4_;
                              auVar95._8_4_ = fVar48 * auVar74._8_4_ + auVar106._8_4_;
                              auVar95._12_4_ = fVar48 * auVar74._12_4_ + auVar106._12_4_;
                              auVar106 = ZEXT1664(auVar95);
                              fVar48 = pfVar32[lVar33 * 2 + 1];
                              auVar111._0_4_ = fVar48 * *pfVar44 + auVar116._0_4_;
                              auVar111._4_4_ = fVar48 * pfVar44[1] + auVar116._4_4_;
                              auVar111._8_4_ = fVar48 * pfVar44[2] + auVar116._8_4_;
                              auVar111._12_4_ = fVar48 * pfVar44[3] + auVar116._12_4_;
                              auVar116 = ZEXT1664(auVar111);
                              auVar119._0_4_ = fVar48 * auVar72._0_4_ + auVar123._0_4_;
                              auVar119._4_4_ = fVar48 * auVar72._4_4_ + auVar123._4_4_;
                              auVar119._8_4_ = fVar48 * auVar72._8_4_ + auVar123._8_4_;
                              auVar119._12_4_ = fVar48 * auVar72._12_4_ + auVar123._12_4_;
                              auVar123 = ZEXT1664(auVar119);
                              auVar126._0_4_ = fVar48 * auVar74._0_4_ + auVar131._0_4_;
                              auVar126._4_4_ = fVar48 * auVar74._4_4_ + auVar131._4_4_;
                              auVar126._8_4_ = fVar48 * auVar74._8_4_ + auVar131._8_4_;
                              auVar126._12_4_ = fVar48 * auVar74._12_4_ + auVar131._12_4_;
                              auVar131 = ZEXT1664(auVar126);
                              pfVar44 = pfVar44 + 0xc;
                              lVar33 = lVar33 + 1;
                            } while (iVar42 != (int)lVar33);
                          }
                          if (iVar15 < iVar29) {
                            auVar73 = vunpcklps_avx(auVar54,auVar111);
                            auVar72 = vunpckhps_avx(auVar54,auVar111);
                            auVar84 = vunpcklps_avx(auVar79,auVar119);
                            auVar74 = vunpckhps_avx(auVar79,auVar119);
                            auVar75 = vunpcklps_avx(auVar95,auVar126);
                            auVar91 = vunpckhps_avx(auVar95,auVar126);
                            *(undefined1 (*) [16])*pauVar18 = auVar73;
                            *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar72;
                            *(undefined1 (*) [16])pauVar18[1] = auVar84;
                            *(undefined1 (*) [16])(pauVar18[1] + 0x10) = auVar74;
                            *(undefined1 (*) [16])pauVar18[2] = auVar75;
                            *(undefined1 (*) [16])(pauVar18[2] + 0x10) = auVar91;
                          }
                          else {
                            *pauVar19 = auVar54;
                            pauVar19[1] = auVar79;
                            pauVar19[2] = auVar95;
                            *(undefined1 (*) [16])(*pauVar19 + lVar17 * 4) = auVar111;
                            *(undefined1 (*) [16])(pauVar19[1] + lVar17 * 4) = auVar119;
                            *(undefined1 (*) [16])(pauVar19[2] + lVar17 * 4) = auVar126;
                            pauVar19 = pauVar19 + 3;
                          }
                          pauVar18 = pauVar18 + 3;
                          uVar36 = uVar22 + 0xc;
                          iVar16 = uVar22 + 0x17;
                          uVar22 = uVar36;
                        } while (iVar16 < (int)uVar21);
                      }
                      iVar16 = uVar36 + 7;
                      while (iVar16 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar116 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar25 = *(undefined4 *)*pauVar26;
                            auVar55._4_4_ = uVar25;
                            auVar55._0_4_ = uVar25;
                            auVar55._8_4_ = uVar25;
                            auVar55._12_4_ = uVar25;
                            auVar71 = ZEXT1664(auVar55);
                            uVar25 = *(undefined4 *)(*pauVar26 + 4);
                            auVar96._4_4_ = uVar25;
                            auVar96._0_4_ = uVar25;
                            auVar96._8_4_ = uVar25;
                            auVar96._12_4_ = uVar25;
                            auVar106 = ZEXT1664(auVar96);
                            auVar90 = ZEXT1664(auVar55);
                            auVar116 = ZEXT1664(auVar96);
                          }
                        }
                        else {
                          auVar72 = vshufps_avx(*(undefined1 (*) [16])*pauVar18,
                                                *(undefined1 (*) [16])(*pauVar18 + 0x10),0x88);
                          auVar71 = ZEXT1664(auVar72);
                          auVar72 = vshufps_avx(*(undefined1 (*) [16])pauVar18[1],
                                                *(undefined1 (*) [16])(pauVar18[1] + 0x10),0x88);
                          auVar90 = ZEXT1664(auVar72);
                          auVar72 = vshufps_avx(*(undefined1 (*) [16])*pauVar18,
                                                *(undefined1 (*) [16])(*pauVar18 + 0x10),0xdd);
                          auVar106 = ZEXT1664(auVar72);
                          auVar72 = vshufps_avx(*(undefined1 (*) [16])pauVar18[1],
                                                *(undefined1 (*) [16])(pauVar18[1] + 0x10),0xdd);
                          auVar116 = ZEXT1664(auVar72);
                        }
                        auVar112 = auVar116._0_16_;
                        auVar80 = auVar90._0_16_;
                        auVar97 = auVar106._0_16_;
                        auVar56 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar33 = 0;
                          do {
                            auVar72 = *(undefined1 (*) [16])(pfVar44 + 4);
                            fVar48 = pfVar32[lVar33 * 2];
                            auVar56._0_4_ = fVar48 * *pfVar44 + auVar71._0_4_;
                            auVar56._4_4_ = fVar48 * pfVar44[1] + auVar71._4_4_;
                            auVar56._8_4_ = fVar48 * pfVar44[2] + auVar71._8_4_;
                            auVar56._12_4_ = fVar48 * pfVar44[3] + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar56);
                            auVar80._0_4_ = fVar48 * auVar72._0_4_ + auVar90._0_4_;
                            auVar80._4_4_ = fVar48 * auVar72._4_4_ + auVar90._4_4_;
                            auVar80._8_4_ = fVar48 * auVar72._8_4_ + auVar90._8_4_;
                            auVar80._12_4_ = fVar48 * auVar72._12_4_ + auVar90._12_4_;
                            auVar90 = ZEXT1664(auVar80);
                            fVar48 = pfVar32[lVar33 * 2 + 1];
                            auVar97._0_4_ = fVar48 * *pfVar44 + auVar106._0_4_;
                            auVar97._4_4_ = fVar48 * pfVar44[1] + auVar106._4_4_;
                            auVar97._8_4_ = fVar48 * pfVar44[2] + auVar106._8_4_;
                            auVar97._12_4_ = fVar48 * pfVar44[3] + auVar106._12_4_;
                            auVar106 = ZEXT1664(auVar97);
                            auVar112._0_4_ = fVar48 * auVar72._0_4_ + auVar116._0_4_;
                            auVar112._4_4_ = fVar48 * auVar72._4_4_ + auVar116._4_4_;
                            auVar112._8_4_ = fVar48 * auVar72._8_4_ + auVar116._8_4_;
                            auVar112._12_4_ = fVar48 * auVar72._12_4_ + auVar116._12_4_;
                            auVar116 = ZEXT1664(auVar112);
                            pfVar44 = pfVar44 + 8;
                            lVar33 = lVar33 + 1;
                          } while ((int)lVar41 != (int)lVar33);
                        }
                        if (iVar15 < iVar29) {
                          auVar91 = vunpcklps_avx(auVar56,auVar97);
                          auVar72 = vunpckhps_avx(auVar56,auVar97);
                          auVar73 = vunpcklps_avx(auVar80,auVar112);
                          auVar74 = vunpckhps_avx(auVar80,auVar112);
                          *(undefined1 (*) [16])*pauVar18 = auVar91;
                          *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar72;
                          *(undefined1 (*) [16])pauVar18[1] = auVar73;
                          *(undefined1 (*) [16])(pauVar18[1] + 0x10) = auVar74;
                        }
                        else {
                          *pauVar19 = auVar56;
                          pauVar19[1] = auVar80;
                          *(undefined1 (*) [16])(*pauVar19 + lVar17 * 4) = auVar97;
                          *(undefined1 (*) [16])(pauVar19[1] + lVar17 * 4) = auVar112;
                          pauVar19 = pauVar19 + 2;
                        }
                        pauVar18 = pauVar18 + 2;
                        iVar16 = uVar36 + 0xf;
                        uVar36 = uVar36 + 8;
                      }
                      uVar22 = uVar36 | 3;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar25 = *(undefined4 *)*pauVar26;
                            auVar71 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(uVar25,
                                                  uVar25))));
                            uVar25 = *(undefined4 *)(*pauVar26 + 4);
                            auVar90 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(uVar25,
                                                  uVar25))));
                          }
                        }
                        else {
                          auVar72 = vshufps_avx(*(undefined1 (*) [16])*pauVar18,
                                                *(undefined1 (*) [16])(*pauVar18 + 0x10),0x88);
                          auVar71 = ZEXT1664(auVar72);
                          auVar72 = vshufps_avx(*(undefined1 (*) [16])*pauVar18,
                                                *(undefined1 (*) [16])(*pauVar18 + 0x10),0xdd);
                          auVar90 = ZEXT1664(auVar72);
                        }
                        auVar81 = auVar90._0_16_;
                        auVar57 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar33 = 0;
                          do {
                            fVar48 = pfVar32[lVar33 * 2];
                            auVar57._0_4_ = fVar48 * *pfVar44 + auVar71._0_4_;
                            auVar57._4_4_ = fVar48 * pfVar44[1] + auVar71._4_4_;
                            auVar57._8_4_ = fVar48 * pfVar44[2] + auVar71._8_4_;
                            auVar57._12_4_ = fVar48 * pfVar44[3] + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar57);
                            fVar48 = pfVar32[lVar33 * 2 + 1];
                            auVar81._0_4_ = fVar48 * *pfVar44 + auVar90._0_4_;
                            auVar81._4_4_ = fVar48 * pfVar44[1] + auVar90._4_4_;
                            auVar81._8_4_ = fVar48 * pfVar44[2] + auVar90._8_4_;
                            auVar81._12_4_ = fVar48 * pfVar44[3] + auVar90._12_4_;
                            auVar90 = ZEXT1664(auVar81);
                            pfVar44 = pfVar44 + 4;
                            lVar33 = lVar33 + 1;
                          } while ((int)lVar41 != (int)lVar33);
                        }
                        if (iVar15 < iVar29) {
                          auVar74 = vunpcklps_avx(auVar57,auVar81);
                          auVar72 = vunpckhps_avx(auVar57,auVar81);
                          *(undefined1 (*) [16])*pauVar18 = auVar74;
                          *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar72;
                        }
                        else {
                          *pauVar19 = auVar57;
                          *(undefined1 (*) [16])(*pauVar19 + lVar17 * 4) = auVar81;
                          pauVar19 = pauVar19 + 1;
                        }
                        pauVar18 = pauVar18 + 1;
                        uVar22 = uVar36 + 7;
                        uVar36 = uVar36 + 4;
                      }
                      uVar22 = uVar36 | 1;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar26 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar71 = ZEXT1664(CONCAT88(*(undefined8 *)*pauVar26,
                                                        *(undefined8 *)*pauVar26));
                          }
                        }
                        else {
                          auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                        }
                        auVar58 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar33 = 0;
                          lVar38 = 0;
                          do {
                            auVar98._8_8_ = 0;
                            auVar98._0_8_ = *(ulong *)(pfVar44 + lVar38 * 2);
                            auVar72 = vshufps_avx(auVar98,auVar98,0x50);
                            fVar48 = (float)*(undefined8 *)(pfVar32 + lVar38 * 2);
                            fVar3 = (float)((ulong)*(undefined8 *)(pfVar32 + lVar38 * 2) >> 0x20);
                            auVar58._0_4_ = auVar72._0_4_ * fVar48 + auVar71._0_4_;
                            auVar58._4_4_ = auVar72._4_4_ * fVar3 + auVar71._4_4_;
                            auVar58._8_4_ = auVar72._8_4_ * fVar48 + auVar71._8_4_;
                            auVar58._12_4_ = auVar72._12_4_ * fVar3 + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar58);
                            lVar38 = lVar38 + 1;
                            lVar33 = lVar33 + -8;
                          } while (iVar42 != (int)lVar38);
                          pfVar44 = (float *)((long)pfVar44 - lVar33);
                        }
                        if (iVar15 < iVar29) {
                          *(undefined1 (*) [16])*pauVar18 = auVar58;
                        }
                        else {
                          auVar72 = vshufps_avx(auVar58,auVar58,0xe8);
                          uVar1 = vmovlps_avx(auVar72);
                          *(undefined8 *)*pauVar19 = uVar1;
                          uVar25 = vextractps_avx(auVar58,1);
                          *(undefined4 *)(*pauVar19 + lVar17 * 4) = uVar25;
                          uVar25 = vextractps_avx(auVar58,3);
                          *(undefined4 *)
                           (*pauVar19 + ((long)((local_a0 << 0x20) + 0x100000000) >> 0x20) * 4) =
                               uVar25;
                          pauVar19 = (undefined1 (*) [16])(*pauVar19 + 8);
                        }
                        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                        uVar22 = uVar36 + 3;
                        uVar36 = uVar36 + 2;
                      }
                      if ((int)uVar36 < (int)uVar21) {
                        do {
                          pauVar34 = pauVar18;
                          if ((iVar28 != 0) ||
                             (auVar59 = ZEXT816(0) << 0x40, pauVar34 = pauVar26,
                             pauVar26 != (undefined1 (*) [32])0x0)) {
                            auVar59._8_8_ = 0;
                            auVar59._0_8_ = *(ulong *)*pauVar34;
                          }
                          if (0 < iVar45) {
                            lVar33 = 0;
                            auVar72 = auVar59;
                            do {
                              fVar48 = *pfVar44;
                              auVar59._0_4_ =
                                   (float)*(undefined8 *)(pfVar32 + lVar33 * 2) * fVar48 +
                                   auVar72._0_4_;
                              auVar59._4_4_ =
                                   (float)((ulong)*(undefined8 *)(pfVar32 + lVar33 * 2) >> 0x20) *
                                   fVar48 + auVar72._4_4_;
                              auVar59._8_4_ = fVar48 * 0.0 + auVar72._8_4_;
                              auVar59._12_4_ = fVar48 * 0.0 + auVar72._12_4_;
                              pfVar44 = pfVar44 + 1;
                              lVar33 = lVar33 + 1;
                              auVar72 = auVar59;
                            } while (iVar42 != (int)lVar33);
                          }
                          if (iVar15 < iVar29) {
                            uVar1 = vmovlps_avx(auVar59);
                            *(undefined8 *)*pauVar18 = uVar1;
                          }
                          else {
                            *(int *)*pauVar19 = auVar59._0_4_;
                            uVar25 = vextractps_avx(auVar59,1);
                            *(undefined4 *)(*pauVar19 + lVar17 * 4) = uVar25;
                            pauVar19 = (undefined1 (*) [16])(*pauVar19 + 4);
                          }
                          pauVar18 = (undefined1 (*) [32])(*pauVar18 + 8);
                          uVar36 = uVar36 + 1;
                        } while (uVar36 != uVar21);
                      }
                      pfVar32 = pfVar32 + iVar45 * 2;
                      uVar23 = uVar184 + 2;
                      lVar33 = uVar184 + 3;
                      pauVar34 = pauVar26;
                      uVar184 = uVar23;
                    } while (lVar33 < local_100);
                  }
                  if ((int)uVar23 < (int)local_1c4) {
                    lVar41 = (long)(int)uVar23;
                    do {
                      pauVar34 = (undefined1 (*) [32])
                                 ((long)(this->super_Convolution).bias_data.data +
                                 lVar41 * 4 + local_108 * 4);
                      if (pauVar26 == (undefined1 (*) [32])0x0) {
                        pauVar34 = pauVar26;
                      }
                      uVar36 = 0;
                      pauVar19 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 local_e0 * 4 + (lVar41 + local_108) * (long)iVar30 * 4);
                      pfVar44 = local_1c0;
                      if (0xb < (int)uVar21) {
                        uVar22 = 0;
                        do {
                          if (iVar28 == 0) {
                            if (pauVar34 == (undefined1 (*) [32])0x0) {
                              auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              uVar25 = *(undefined4 *)*pauVar34;
                              auVar60._4_4_ = uVar25;
                              auVar60._0_4_ = uVar25;
                              auVar60._8_4_ = uVar25;
                              auVar60._12_4_ = uVar25;
                              auVar71 = ZEXT1664(auVar60);
                              auVar90 = ZEXT1664(auVar60);
                              auVar106 = ZEXT1664(auVar60);
                            }
                          }
                          else {
                            auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                            auVar90 = ZEXT1664(*(undefined1 (*) [16])(*pauVar18 + 0x10));
                            auVar106 = ZEXT1664(*(undefined1 (*) [16])pauVar18[1]);
                          }
                          auVar99 = auVar106._0_16_;
                          auVar82 = auVar90._0_16_;
                          auVar61 = auVar71._0_16_;
                          if (0 < iVar45) {
                            lVar17 = 0;
                            do {
                              fVar48 = pfVar32[lVar17];
                              auVar61._0_4_ = fVar48 * *pfVar44 + auVar71._0_4_;
                              auVar61._4_4_ = fVar48 * pfVar44[1] + auVar71._4_4_;
                              auVar61._8_4_ = fVar48 * pfVar44[2] + auVar71._8_4_;
                              auVar61._12_4_ = fVar48 * pfVar44[3] + auVar71._12_4_;
                              auVar71 = ZEXT1664(auVar61);
                              auVar82._0_4_ = fVar48 * pfVar44[4] + auVar90._0_4_;
                              auVar82._4_4_ = fVar48 * pfVar44[5] + auVar90._4_4_;
                              auVar82._8_4_ = fVar48 * pfVar44[6] + auVar90._8_4_;
                              auVar82._12_4_ = fVar48 * pfVar44[7] + auVar90._12_4_;
                              auVar90 = ZEXT1664(auVar82);
                              auVar99._0_4_ = fVar48 * pfVar44[8] + auVar106._0_4_;
                              auVar99._4_4_ = fVar48 * pfVar44[9] + auVar106._4_4_;
                              auVar99._8_4_ = fVar48 * pfVar44[10] + auVar106._8_4_;
                              auVar99._12_4_ = fVar48 * pfVar44[0xb] + auVar106._12_4_;
                              auVar106 = ZEXT1664(auVar99);
                              pfVar44 = pfVar44 + 0xc;
                              lVar17 = lVar17 + 1;
                            } while (iVar45 != (int)lVar17);
                          }
                          if (iVar15 < iVar29) {
                            *(undefined1 (*) [16])*pauVar18 = auVar61;
                            *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar82;
                            *(undefined1 (*) [16])pauVar18[1] = auVar99;
                          }
                          else {
                            *pauVar19 = auVar61;
                            pauVar19[1] = auVar82;
                            pauVar19[2] = auVar99;
                            pauVar19 = pauVar19 + 3;
                          }
                          pauVar18 = (undefined1 (*) [32])(pauVar18[1] + 0x10);
                          uVar36 = uVar22 + 0xc;
                          iVar42 = uVar22 + 0x17;
                          uVar22 = uVar36;
                        } while (iVar42 < (int)uVar21);
                      }
                      iVar42 = uVar36 + 7;
                      while (iVar42 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar34 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar25 = *(undefined4 *)*pauVar34;
                            auVar62._4_4_ = uVar25;
                            auVar62._0_4_ = uVar25;
                            auVar62._8_4_ = uVar25;
                            auVar62._12_4_ = uVar25;
                            auVar71 = ZEXT1664(auVar62);
                            auVar90 = ZEXT1664(auVar62);
                          }
                        }
                        else {
                          auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                          auVar90 = ZEXT1664(*(undefined1 (*) [16])(*pauVar18 + 0x10));
                        }
                        auVar83 = auVar90._0_16_;
                        auVar63 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar17 = 0;
                          do {
                            fVar48 = pfVar32[lVar17];
                            auVar63._0_4_ = fVar48 * *pfVar44 + auVar71._0_4_;
                            auVar63._4_4_ = fVar48 * pfVar44[1] + auVar71._4_4_;
                            auVar63._8_4_ = fVar48 * pfVar44[2] + auVar71._8_4_;
                            auVar63._12_4_ = fVar48 * pfVar44[3] + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar63);
                            auVar83._0_4_ = fVar48 * pfVar44[4] + auVar90._0_4_;
                            auVar83._4_4_ = fVar48 * pfVar44[5] + auVar90._4_4_;
                            auVar83._8_4_ = fVar48 * pfVar44[6] + auVar90._8_4_;
                            auVar83._12_4_ = fVar48 * pfVar44[7] + auVar90._12_4_;
                            auVar90 = ZEXT1664(auVar83);
                            pfVar44 = pfVar44 + 8;
                            lVar17 = lVar17 + 1;
                          } while (iVar45 != (int)lVar17);
                        }
                        if (iVar15 < iVar29) {
                          *(undefined1 (*) [16])*pauVar18 = auVar63;
                          *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar83;
                        }
                        else {
                          *pauVar19 = auVar63;
                          pauVar19[1] = auVar83;
                          pauVar19 = pauVar19 + 2;
                        }
                        pauVar18 = pauVar18 + 1;
                        iVar42 = uVar36 + 0xf;
                        uVar36 = uVar36 + 8;
                      }
                      uVar22 = uVar36 | 3;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar34 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar25 = *(undefined4 *)*pauVar34;
                            auVar71 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(uVar25,
                                                  uVar25))));
                          }
                        }
                        else {
                          auVar71 = ZEXT1664(*(undefined1 (*) [16])*pauVar18);
                        }
                        auVar64 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar17 = 0;
                          do {
                            fVar48 = pfVar32[lVar17];
                            auVar64._0_4_ = fVar48 * *pfVar44 + auVar71._0_4_;
                            auVar64._4_4_ = fVar48 * pfVar44[1] + auVar71._4_4_;
                            auVar64._8_4_ = fVar48 * pfVar44[2] + auVar71._8_4_;
                            auVar64._12_4_ = fVar48 * pfVar44[3] + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar64);
                            pfVar44 = pfVar44 + 4;
                            lVar17 = lVar17 + 1;
                          } while (iVar45 != (int)lVar17);
                        }
                        if (iVar15 < iVar29) {
                          *(undefined1 (*) [16])*pauVar18 = auVar64;
                        }
                        else {
                          *pauVar19 = auVar64;
                          pauVar19 = pauVar19 + 1;
                        }
                        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
                        uVar22 = uVar36 + 7;
                        uVar36 = uVar36 + 4;
                      }
                      uVar22 = uVar36 | 1;
                      while ((int)uVar22 < (int)uVar21) {
                        if (iVar28 == 0) {
                          if (pauVar34 == (undefined1 (*) [32])0x0) {
                            auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar25 = *(undefined4 *)*pauVar34;
                            auVar71 = ZEXT1664(CONCAT412(uVar25,CONCAT48(uVar25,CONCAT44(uVar25,
                                                  uVar25))));
                          }
                        }
                        else {
                          auVar71 = ZEXT864(*(ulong *)*pauVar18);
                        }
                        auVar65 = auVar71._0_16_;
                        if (0 < iVar45) {
                          lVar17 = 0;
                          lVar33 = 0;
                          do {
                            fVar48 = pfVar32[lVar33];
                            auVar65._0_4_ =
                                 (float)*(undefined8 *)(pfVar44 + lVar33 * 2) * fVar48 +
                                 auVar71._0_4_;
                            auVar65._4_4_ =
                                 (float)((ulong)*(undefined8 *)(pfVar44 + lVar33 * 2) >> 0x20) *
                                 fVar48 + auVar71._4_4_;
                            auVar65._8_4_ = fVar48 * 0.0 + auVar71._8_4_;
                            auVar65._12_4_ = fVar48 * 0.0 + auVar71._12_4_;
                            auVar71 = ZEXT1664(auVar65);
                            lVar33 = lVar33 + 1;
                            lVar17 = lVar17 + -8;
                          } while (iVar45 != (int)lVar33);
                          pfVar44 = (float *)((long)pfVar44 - lVar17);
                        }
                        if (iVar15 < iVar29) {
                          uVar1 = vmovlps_avx(auVar65);
                          *(undefined8 *)*pauVar18 = uVar1;
                        }
                        else {
                          uVar1 = vmovlps_avx(auVar65);
                          *(undefined8 *)*pauVar19 = uVar1;
                          pauVar19 = (undefined1 (*) [16])(*pauVar19 + 8);
                        }
                        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 8);
                        uVar22 = uVar36 + 3;
                        uVar36 = uVar36 + 2;
                      }
                      if ((int)uVar36 < (int)uVar21) {
                        do {
                          auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
                          if (pauVar34 != (undefined1 (*) [32])0x0 || iVar28 != 0) {
                            pauVar26 = pauVar34;
                            if (iVar28 != 0) {
                              pauVar26 = pauVar18;
                            }
                            auVar71 = ZEXT464(*(uint *)*pauVar26);
                          }
                          fVar48 = auVar71._0_4_;
                          if (0 < iVar45) {
                            lVar17 = 0;
                            do {
                              fVar48 = *pfVar44 * pfVar32[lVar17] + auVar71._0_4_;
                              auVar71 = ZEXT464((uint)fVar48);
                              pfVar44 = pfVar44 + 1;
                              lVar17 = lVar17 + 1;
                            } while (iVar45 != (int)lVar17);
                          }
                          if (iVar15 < iVar29) {
                            *(float *)*pauVar18 = fVar48;
                          }
                          else {
                            *(float *)*pauVar19 = fVar48;
                            pauVar19 = (undefined1 (*) [16])(*pauVar19 + 4);
                          }
                          pauVar18 = (undefined1 (*) [32])(*pauVar18 + 4);
                          uVar36 = uVar36 + 1;
                        } while (uVar36 != uVar21);
                      }
                      lVar41 = lVar41 + 1;
                      pfVar32 = pfVar32 + iVar45;
                      pauVar26 = pauVar34;
                    } while (lVar41 != local_100);
                  }
                  iVar28 = iVar28 + TILE_K;
                  local_10c = uVar21;
                  local_e4 = iVar14;
                } while (iVar28 < iVar29);
              }
              iVar14 = iVar14 + TILE_N;
              uVar23 = local_70;
            } while (iVar14 < (int)local_70);
          }
          uVar21 = (int)uVar20 + 1;
          uVar184 = (ulong)uVar21;
          local_60 = uVar20;
        } while (uVar21 != local_ec);
      }
      iVar16 = 0;
    }
    piVar2 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
  }
  piVar2 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize._0_4_ = 0;
  local_158.elemsize._4_4_ = 0;
  local_158.elempack = 0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  if (iVar16 == 0) {
    pLVar35 = this->activation;
    iVar16 = 0;
    if (pLVar35 != (Layer *)0x0) {
      (*pLVar35->_vptr_Layer[9])(pLVar35,top_blob,opt);
      iVar16 = 0;
    }
  }
LAB_0020cc39:
  piVar2 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar2 == (int *)0x0) {
    return iVar16;
  }
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 != 0) {
    return iVar16;
  }
  if (local_228.allocator != (Allocator *)0x0) {
    (*(local_228.allocator)->_vptr_Allocator[3])();
    return iVar16;
  }
  if (local_228.data == (void *)0x0) {
    return iVar16;
  }
  free(local_228.data);
  return iVar16;
}

Assistant:

int Convolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}